

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  Primitive *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  Primitive PVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined3 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  unkbyte9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [13];
  undefined1 auVar71 [12];
  undefined1 auVar72 [13];
  undefined1 auVar73 [12];
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [13];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined6 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [15];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [13];
  undefined1 auVar100 [15];
  byte bVar101;
  ulong uVar102;
  ulong uVar103;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar104;
  long lVar105;
  undefined4 uVar106;
  undefined8 unaff_RBP;
  long lVar108;
  ulong uVar109;
  bool bVar110;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  float fVar115;
  undefined2 uVar142;
  float fVar144;
  undefined1 auVar116 [12];
  float fVar143;
  vfloat_impl<4> p00;
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  short sVar145;
  int iVar146;
  undefined1 auVar148 [12];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar150 [16];
  int iVar181;
  char cVar184;
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar149 [12];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar180 [16];
  char cVar185;
  char cVar210;
  float t1;
  float fVar186;
  float fVar187;
  undefined2 uVar211;
  float fVar212;
  float fVar214;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined2 uVar213;
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  float fVar215;
  float fVar216;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  char cVar227;
  float fVar217;
  float fVar218;
  undefined8 uVar219;
  float fVar228;
  float fVar230;
  undefined1 auVar222 [16];
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar234 [12];
  float fVar255;
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar262;
  float fVar273;
  float fVar275;
  undefined1 auVar263 [16];
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar280;
  undefined1 auVar279 [16];
  float fVar281;
  undefined1 auVar282 [12];
  float fVar301;
  vfloat4 a_2;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar283 [12];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar305;
  undefined1 uVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar306 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar320;
  float fVar335;
  float fVar337;
  undefined1 auVar322 [12];
  undefined1 auVar323 [16];
  float fVar321;
  undefined1 auVar327 [16];
  float fVar336;
  float fVar338;
  float fVar339;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar340;
  float fVar341;
  float fVar348;
  float fVar351;
  vfloat4 a_1;
  undefined1 auVar342 [16];
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar355;
  float fVar356;
  float fVar363;
  float fVar365;
  vfloat4 a_3;
  undefined1 auVar357 [16];
  float fVar364;
  float fVar366;
  float fVar367;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar368;
  float fVar369;
  float fVar377;
  float fVar378;
  undefined1 auVar370 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar379;
  float fVar380;
  float fVar387;
  float fVar389;
  undefined1 auVar381 [16];
  float fVar388;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  float fVar393;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  float fVar402;
  float fVar408;
  float fVar409;
  undefined1 auVar403 [16];
  float fVar410;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_428;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3d8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3cc;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  ulong local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  undefined8 uStack_2a0;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  float local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar107;
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar147 [12];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  int iVar182;
  int iVar183;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar220 [12];
  undefined1 auVar223 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  
  PVar11 = prim[1];
  uVar102 = (ulong)(byte)PVar11;
  lVar108 = uVar102 * 0x25;
  uVar106 = *(undefined4 *)(prim + uVar102 * 4 + 6);
  uVar12 = *(undefined4 *)(prim + uVar102 * 5 + 6);
  uVar13 = *(undefined4 *)(prim + uVar102 * 6 + 6);
  uVar14 = *(undefined4 *)(prim + uVar102 * 0xf + 6);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  uVar16 = *(undefined4 *)(prim + uVar102 * 0x11 + 6);
  uVar17 = *(undefined4 *)(prim + uVar102 * 0x1a + 6);
  uVar18 = *(undefined4 *)(prim + uVar102 * 0x1b + 6);
  pPVar5 = prim + lVar108 + 6;
  fVar365 = *(float *)(pPVar5 + 0xc);
  fVar115 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar365;
  fVar143 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar365;
  fVar144 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar365;
  fVar355 = fVar365 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar363 = fVar365 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar365 = fVar365 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar19 = *(undefined4 *)(prim + uVar102 * 0x1c + 6);
  auVar37[0xd] = 0;
  auVar37._0_13_ = in_XMM1._0_13_;
  auVar37[0xe] = in_XMM1[7];
  auVar41[0xc] = in_XMM1[6];
  auVar41._0_12_ = in_XMM1._0_12_;
  auVar41._13_2_ = auVar37._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = in_XMM1._0_11_;
  auVar45._12_3_ = auVar41._12_3_;
  auVar49[10] = in_XMM1[5];
  auVar49._0_10_ = in_XMM1._0_10_;
  auVar49._11_4_ = auVar45._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = in_XMM1._0_9_;
  auVar53._10_5_ = auVar49._10_5_;
  auVar57[8] = in_XMM1[4];
  auVar57._0_8_ = in_XMM1._0_8_;
  auVar57._9_6_ = auVar53._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar12 >> 0x18)),in_XMM1[3]);
  auVar69._2_9_ = Var68;
  auVar69[1] = (char)((uint)uVar12 >> 0x10);
  auVar69[0] = in_XMM1[2];
  cVar210 = (char)((uint)uVar12 >> 8);
  auVar70._2_11_ = auVar69;
  auVar70[1] = cVar210;
  auVar70[0] = in_XMM1[1];
  cVar185 = (char)uVar12;
  sVar145 = CONCAT11(cVar185,in_XMM1[0]);
  auVar64._2_13_ = auVar70;
  auVar64._0_2_ = sVar145;
  uVar142 = (undefined2)Var68;
  auVar152._0_12_ = auVar64._0_12_;
  auVar152._12_2_ = uVar142;
  auVar152._14_2_ = uVar142;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar64._0_10_;
  auVar151._10_2_ = auVar69._0_2_;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = auVar64._0_8_;
  auVar150._8_2_ = auVar69._0_2_;
  auVar71._4_8_ = auVar150._8_8_;
  auVar71._2_2_ = auVar70._0_2_;
  auVar71._0_2_ = auVar70._0_2_;
  iVar146 = (int)sVar145 >> 8;
  iVar181 = auVar71._0_4_ >> 0x18;
  auVar147._0_8_ = CONCAT44(iVar181,iVar146);
  auVar147._8_4_ = auVar150._8_4_ >> 0x18;
  auVar153._12_4_ = auVar151._12_4_ >> 0x18;
  auVar153._0_12_ = auVar147;
  fVar280 = (float)iVar181;
  cVar184 = cVar210 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar153._0_13_;
  auVar38[0xe] = cVar184;
  auVar42[0xc] = cVar184;
  auVar42._0_12_ = auVar147;
  auVar42._13_2_ = auVar38._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar147._0_11_;
  auVar46._12_3_ = auVar42._12_3_;
  auVar50[10] = cVar184;
  auVar50._0_10_ = auVar147._0_10_;
  auVar50._11_4_ = auVar46._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar147._0_9_;
  auVar54._10_5_ = auVar50._10_5_;
  auVar58[8] = cVar210;
  auVar58._0_8_ = auVar147._0_8_;
  auVar58._9_6_ = auVar54._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar13 >> 0x18)),(short)cVar185 >> 7);
  auVar61._6_9_ = Var68;
  auVar61[5] = (char)((uint)uVar13 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar185 >> 7);
  auVar61._0_4_ = iVar146;
  cVar227 = (char)((uint)uVar13 >> 8);
  auVar72._2_11_ = auVar61._4_11_;
  auVar72[1] = cVar227;
  auVar72[0] = (undefined1)((short)cVar185 >> 7);
  cVar210 = (char)uVar13;
  auVar65._2_13_ = auVar72;
  auVar65._0_2_ = CONCAT11(cVar210,cVar185);
  uVar142 = (undefined2)Var68;
  auVar156._0_12_ = auVar65._0_12_;
  auVar156._12_2_ = uVar142;
  auVar156._14_2_ = uVar142;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar65._0_10_;
  auVar155._10_2_ = auVar61._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar65._0_8_;
  auVar154._8_2_ = auVar61._4_2_;
  auVar73._4_8_ = auVar154._8_8_;
  auVar73._2_2_ = auVar72._0_2_;
  auVar73._0_2_ = auVar72._0_2_;
  iVar181 = (int)CONCAT11(cVar210,cVar185) >> 8;
  iVar182 = auVar73._0_4_ >> 0x18;
  auVar148._0_8_ = CONCAT44(iVar182,iVar181);
  auVar148._8_4_ = auVar154._8_4_ >> 0x18;
  auVar157._12_4_ = auVar155._12_4_ >> 0x18;
  auVar157._0_12_ = auVar148;
  fVar348 = (float)iVar182;
  cVar184 = cVar227 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar157._0_13_;
  auVar39[0xe] = cVar184;
  auVar43[0xc] = cVar184;
  auVar43._0_12_ = auVar148;
  auVar43._13_2_ = auVar39._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar148._0_11_;
  auVar47._12_3_ = auVar43._12_3_;
  auVar51[10] = cVar184;
  auVar51._0_10_ = auVar148._0_10_;
  auVar51._11_4_ = auVar47._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar148._0_9_;
  auVar55._10_5_ = auVar51._10_5_;
  auVar59[8] = cVar227;
  auVar59._0_8_ = auVar148._0_8_;
  auVar59._9_6_ = auVar55._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar15 >> 0x18)),(short)cVar210 >> 7);
  auVar62._6_9_ = Var68;
  auVar62[5] = (char)((uint)uVar15 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar210 >> 7);
  auVar62._0_4_ = iVar181;
  cVar227 = (char)((uint)uVar15 >> 8);
  auVar74._2_11_ = auVar62._4_11_;
  auVar74[1] = cVar227;
  auVar74[0] = (undefined1)((short)cVar210 >> 7);
  cVar185 = (char)uVar15;
  auVar66._2_13_ = auVar74;
  auVar66._0_2_ = CONCAT11(cVar185,cVar210);
  uVar142 = (undefined2)Var68;
  auVar160._0_12_ = auVar66._0_12_;
  auVar160._12_2_ = uVar142;
  auVar160._14_2_ = uVar142;
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_10_ = auVar66._0_10_;
  auVar159._10_2_ = auVar62._4_2_;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._0_8_ = auVar66._0_8_;
  auVar158._8_2_ = auVar62._4_2_;
  auVar75._4_8_ = auVar158._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  iVar182 = (int)CONCAT11(cVar185,cVar210) >> 8;
  iVar183 = auVar75._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar183,iVar182);
  auVar149._8_4_ = auVar158._8_4_ >> 0x18;
  auVar161._12_4_ = auVar159._12_4_ >> 0x18;
  auVar161._0_12_ = auVar149;
  fVar301 = (float)iVar183;
  cVar184 = cVar227 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar161._0_13_;
  auVar40[0xe] = cVar184;
  auVar44[0xc] = cVar184;
  auVar44._0_12_ = auVar149;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar149._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = cVar184;
  auVar52._0_10_ = auVar149._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar149._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = cVar227;
  auVar60._0_8_ = auVar149._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar185 >> 7);
  auVar63._6_9_ = Var68;
  auVar63[5] = (char)((uint)uVar16 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar185 >> 7);
  auVar63._0_4_ = iVar182;
  auVar76._2_11_ = auVar63._4_11_;
  auVar76[1] = (char)((uint)uVar16 >> 8);
  auVar76[0] = (undefined1)((short)cVar185 >> 7);
  sVar145 = CONCAT11((char)uVar16,cVar185);
  auVar67._2_13_ = auVar76;
  auVar67._0_2_ = sVar145;
  uVar142 = (undefined2)Var68;
  auVar164._0_12_ = auVar67._0_12_;
  auVar164._12_2_ = uVar142;
  auVar164._14_2_ = uVar142;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar67._0_10_;
  auVar163._10_2_ = auVar63._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar67._0_8_;
  auVar162._8_2_ = auVar63._4_2_;
  auVar77._4_8_ = auVar162._8_8_;
  auVar77._2_2_ = auVar76._0_2_;
  auVar77._0_2_ = auVar76._0_2_;
  fVar320 = (float)((int)sVar145 >> 8);
  fVar335 = (float)(auVar77._0_4_ >> 0x18);
  fVar337 = (float)(auVar162._8_4_ >> 0x18);
  fVar217 = fVar365 * fVar320;
  fVar228 = fVar365 * fVar335;
  auVar220._0_8_ = CONCAT44(fVar228,fVar217);
  auVar220._8_4_ = fVar365 * fVar337;
  auVar221._12_4_ = fVar365 * (float)(auVar163._12_4_ >> 0x18);
  auVar221._0_12_ = auVar220;
  fVar186 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar108 + 0x16)) *
            *(float *)(prim + lVar108 + 0x1a);
  local_418[0] = (undefined1)uVar106;
  local_418[1] = (undefined1)((uint)uVar106 >> 8);
  local_418[2] = (undefined1)((uint)uVar106 >> 0x10);
  local_418[3] = (undefined1)((uint)uVar106 >> 0x18);
  auVar90[0xd] = 0;
  auVar90._0_13_ = auVar221._0_13_;
  auVar90[0xe] = (char)((uint)fVar228 >> 0x18);
  auVar93[0xc] = (char)((uint)fVar228 >> 0x10);
  auVar93._0_12_ = auVar220;
  auVar93._13_2_ = auVar90._13_2_;
  auVar94[0xb] = 0;
  auVar94._0_11_ = auVar220._0_11_;
  auVar94._12_3_ = auVar93._12_3_;
  auVar95[10] = (char)((uint)fVar228 >> 8);
  auVar95._0_10_ = auVar220._0_10_;
  auVar95._11_4_ = auVar94._11_4_;
  auVar96[9] = 0;
  auVar96._0_9_ = auVar220._0_9_;
  auVar96._10_5_ = auVar95._10_5_;
  auVar97[8] = SUB41(fVar228,0);
  auVar97._0_8_ = auVar220._0_8_;
  auVar97._9_6_ = auVar96._9_6_;
  Var68 = CONCAT81(CONCAT71(auVar97._8_7_,local_418[3]),(char)((uint)fVar217 >> 0x18));
  auVar98._6_9_ = Var68;
  auVar98[5] = local_418[2];
  auVar98[4] = (char)((uint)fVar217 >> 0x10);
  auVar98._0_4_ = fVar217;
  auVar99._2_11_ = auVar98._4_11_;
  auVar99[1] = local_418[1];
  auVar99[0] = (char)((uint)fVar217 >> 8);
  sVar145 = CONCAT11(local_418[0],SUB41(fVar217,0));
  auVar100._2_13_ = auVar99;
  auVar100._0_2_ = sVar145;
  uVar142 = (undefined2)Var68;
  auVar224._0_12_ = auVar100._0_12_;
  auVar224._12_2_ = uVar142;
  auVar224._14_2_ = uVar142;
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._0_10_ = auVar100._0_10_;
  auVar223._10_2_ = auVar98._4_2_;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._0_8_ = auVar100._0_8_;
  auVar222._8_2_ = auVar98._4_2_;
  auVar78._4_8_ = auVar222._8_8_;
  auVar78._2_2_ = auVar99._0_2_;
  auVar78._0_2_ = auVar99._0_2_;
  fVar218 = (float)((int)sVar145 >> 8);
  fVar229 = (float)(auVar78._0_4_ >> 0x18);
  fVar230 = (float)(auVar222._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar14 >> 0x18);
  uVar142 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar14 >> 0x10);
  uVar219 = CONCAT35(CONCAT21(uVar142,uVar317),CONCAT14(uVar317,uVar14));
  uVar317 = (undefined1)((uint)uVar14 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar219 >> 0x20),uVar317),uVar317);
  sVar145 = CONCAT11((char)uVar14,(char)uVar14);
  uVar107 = CONCAT62(uVar79,sVar145);
  auVar383._8_4_ = 0;
  auVar383._0_8_ = uVar107;
  auVar383._12_2_ = uVar142;
  auVar383._14_2_ = uVar142;
  uVar142 = (undefined2)((ulong)uVar219 >> 0x20);
  auVar382._12_4_ = auVar383._12_4_;
  auVar382._8_2_ = 0;
  auVar382._0_8_ = uVar107;
  auVar382._10_2_ = uVar142;
  auVar381._10_6_ = auVar382._10_6_;
  auVar381._8_2_ = uVar142;
  auVar381._0_8_ = uVar107;
  uVar142 = (undefined2)uVar79;
  auVar80._4_8_ = auVar381._8_8_;
  auVar80._2_2_ = uVar142;
  auVar80._0_2_ = uVar142;
  fVar379 = (float)((int)sVar145 >> 8);
  fVar387 = (float)(auVar80._0_4_ >> 0x18);
  fVar389 = (float)(auVar381._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar17 >> 0x18);
  uVar142 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar17 >> 0x10);
  uVar219 = CONCAT35(CONCAT21(uVar142,uVar317),CONCAT14(uVar317,uVar17));
  uVar317 = (undefined1)((uint)uVar17 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar219 >> 0x20),uVar317),uVar317);
  sVar145 = CONCAT11((char)uVar17,(char)uVar17);
  uVar107 = CONCAT62(uVar79,sVar145);
  auVar308._8_4_ = 0;
  auVar308._0_8_ = uVar107;
  auVar308._12_2_ = uVar142;
  auVar308._14_2_ = uVar142;
  uVar142 = (undefined2)((ulong)uVar219 >> 0x20);
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar107;
  auVar307._10_2_ = uVar142;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._8_2_ = uVar142;
  auVar306._0_8_ = uVar107;
  uVar142 = (undefined2)uVar79;
  auVar81._4_8_ = auVar306._8_8_;
  auVar81._2_2_ = uVar142;
  auVar81._0_2_ = uVar142;
  fVar305 = (float)((int)sVar145 >> 8);
  fVar318 = (float)(auVar81._0_4_ >> 0x18);
  fVar319 = (float)(auVar306._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar18 >> 0x18);
  uVar142 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar18 >> 0x10);
  uVar219 = CONCAT35(CONCAT21(uVar142,uVar317),CONCAT14(uVar317,uVar18));
  uVar317 = (undefined1)((uint)uVar18 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar219 >> 0x20),uVar317),uVar317);
  sVar145 = CONCAT11((char)uVar18,(char)uVar18);
  uVar107 = CONCAT62(uVar79,sVar145);
  auVar372._8_4_ = 0;
  auVar372._0_8_ = uVar107;
  auVar372._12_2_ = uVar142;
  auVar372._14_2_ = uVar142;
  uVar142 = (undefined2)((ulong)uVar219 >> 0x20);
  auVar371._12_4_ = auVar372._12_4_;
  auVar371._8_2_ = 0;
  auVar371._0_8_ = uVar107;
  auVar371._10_2_ = uVar142;
  auVar370._10_6_ = auVar371._10_6_;
  auVar370._8_2_ = uVar142;
  auVar370._0_8_ = uVar107;
  uVar142 = (undefined2)uVar79;
  auVar82._4_8_ = auVar370._8_8_;
  auVar82._2_2_ = uVar142;
  auVar82._0_2_ = uVar142;
  fVar368 = (float)((int)sVar145 >> 8);
  fVar377 = (float)(auVar82._0_4_ >> 0x18);
  fVar378 = (float)(auVar370._8_4_ >> 0x18);
  uVar317 = (undefined1)((uint)uVar19 >> 0x18);
  uVar142 = CONCAT11(uVar317,uVar317);
  uVar317 = (undefined1)((uint)uVar19 >> 0x10);
  uVar219 = CONCAT35(CONCAT21(uVar142,uVar317),CONCAT14(uVar317,uVar19));
  uVar317 = (undefined1)((uint)uVar19 >> 8);
  uVar79 = CONCAT51(CONCAT41((int)((ulong)uVar219 >> 0x20),uVar317),uVar317);
  sVar145 = CONCAT11((char)uVar19,(char)uVar19);
  uVar107 = CONCAT62(uVar79,sVar145);
  auVar405._8_4_ = 0;
  auVar405._0_8_ = uVar107;
  auVar405._12_2_ = uVar142;
  auVar405._14_2_ = uVar142;
  uVar142 = (undefined2)((ulong)uVar219 >> 0x20);
  auVar404._12_4_ = auVar405._12_4_;
  auVar404._8_2_ = 0;
  auVar404._0_8_ = uVar107;
  auVar404._10_2_ = uVar142;
  auVar403._10_6_ = auVar404._10_6_;
  auVar403._8_2_ = uVar142;
  auVar403._0_8_ = uVar107;
  uVar142 = (undefined2)uVar79;
  auVar83._4_8_ = auVar403._8_8_;
  auVar83._2_2_ = uVar142;
  auVar83._0_2_ = uVar142;
  fVar187 = (float)((int)sVar145 >> 8);
  fVar212 = (float)(auVar83._0_4_ >> 0x18);
  fVar214 = (float)(auVar403._8_4_ >> 0x18);
  fVar402 = fVar355 * fVar218 + fVar363 * (float)iVar146 + fVar365 * (float)iVar181;
  fVar408 = fVar355 * fVar229 + fVar363 * fVar280 + fVar365 * fVar348;
  fVar409 = fVar355 * fVar230 + fVar363 * (float)auVar147._8_4_ + fVar365 * (float)auVar148._8_4_;
  fVar410 = fVar355 * (float)(auVar223._12_4_ >> 0x18) +
            fVar363 * (float)auVar153._12_4_ + fVar365 * (float)auVar157._12_4_;
  fVar393 = fVar355 * fVar379 + fVar363 * (float)iVar182 + fVar217;
  fVar399 = fVar355 * fVar387 + fVar363 * fVar301 + fVar228;
  fVar400 = fVar355 * fVar389 + fVar363 * (float)auVar149._8_4_ + auVar220._8_4_;
  fVar401 = fVar355 * (float)(auVar382._12_4_ >> 0x18) +
            fVar363 * (float)auVar161._12_4_ + auVar221._12_4_;
  fVar261 = fVar355 * fVar305 + fVar363 * fVar368 + fVar365 * fVar187;
  fVar273 = fVar355 * fVar318 + fVar363 * fVar377 + fVar365 * fVar212;
  fVar275 = fVar355 * fVar319 + fVar363 * fVar378 + fVar365 * fVar214;
  fVar355 = fVar355 * (float)(auVar307._12_4_ >> 0x18) +
            fVar363 * (float)(auVar371._12_4_ >> 0x18) + fVar365 * (float)(auVar404._12_4_ >> 0x18);
  uVar219 = *(undefined8 *)(prim + uVar102 * 7 + 6);
  uVar6 = *(undefined8 *)(prim + uVar102 * 0xb + 6);
  uVar7 = *(undefined8 *)(prim + uVar102 * 9 + 6);
  uVar8 = *(undefined8 *)(prim + uVar102 * 0xd + 6);
  uVar107 = *(ulong *)(prim + uVar102 * 0x12 + 6);
  fVar363 = fVar218 * fVar115 + (float)iVar146 * fVar143 + (float)iVar181 * fVar144;
  fVar348 = fVar229 * fVar115 + fVar280 * fVar143 + fVar348 * fVar144;
  fVar231 = fVar230 * fVar115 + (float)auVar147._8_4_ * fVar143 + (float)auVar148._8_4_ * fVar144;
  fVar232 = (float)(auVar223._12_4_ >> 0x18) * fVar115 +
            (float)auVar153._12_4_ * fVar143 + (float)auVar157._12_4_ * fVar144;
  fVar379 = fVar379 * fVar115 + (float)iVar182 * fVar143 + fVar320 * fVar144;
  fVar387 = fVar387 * fVar115 + fVar301 * fVar143 + fVar335 * fVar144;
  fVar389 = fVar389 * fVar115 + (float)auVar149._8_4_ * fVar143 + fVar337 * fVar144;
  fVar391 = (float)(auVar382._12_4_ >> 0x18) * fVar115 +
            (float)auVar161._12_4_ * fVar143 + (float)(auVar163._12_4_ >> 0x18) * fVar144;
  fVar217 = fVar115 * fVar305 + fVar143 * fVar368 + fVar144 * fVar187;
  fVar218 = fVar115 * fVar318 + fVar143 * fVar377 + fVar144 * fVar212;
  fVar228 = fVar115 * fVar319 + fVar143 * fVar378 + fVar144 * fVar214;
  fVar229 = fVar115 * (float)(auVar307._12_4_ >> 0x18) +
            fVar143 * (float)(auVar371._12_4_ >> 0x18) + fVar144 * (float)(auVar404._12_4_ >> 0x18);
  fVar365 = (float)DAT_01f4bd50;
  fVar115 = DAT_01f4bd50._4_4_;
  fVar143 = DAT_01f4bd50._8_4_;
  fVar144 = DAT_01f4bd50._12_4_;
  uVar111 = -(uint)(fVar365 <= ABS(fVar402));
  uVar112 = -(uint)(fVar115 <= ABS(fVar408));
  uVar113 = -(uint)(fVar143 <= ABS(fVar409));
  uVar114 = -(uint)(fVar144 <= ABS(fVar410));
  auVar406._0_4_ = (uint)fVar402 & uVar111;
  auVar406._4_4_ = (uint)fVar408 & uVar112;
  auVar406._8_4_ = (uint)fVar409 & uVar113;
  auVar406._12_4_ = (uint)fVar410 & uVar114;
  auVar188._0_4_ = ~uVar111 & (uint)fVar365;
  auVar188._4_4_ = ~uVar112 & (uint)fVar115;
  auVar188._8_4_ = ~uVar113 & (uint)fVar143;
  auVar188._12_4_ = ~uVar114 & (uint)fVar144;
  auVar188 = auVar188 | auVar406;
  uVar111 = -(uint)(fVar365 <= ABS(fVar393));
  uVar112 = -(uint)(fVar115 <= ABS(fVar399));
  uVar113 = -(uint)(fVar143 <= ABS(fVar400));
  uVar114 = -(uint)(fVar144 <= ABS(fVar401));
  auVar394._0_4_ = (uint)fVar393 & uVar111;
  auVar394._4_4_ = (uint)fVar399 & uVar112;
  auVar394._8_4_ = (uint)fVar400 & uVar113;
  auVar394._12_4_ = (uint)fVar401 & uVar114;
  auVar284._0_4_ = ~uVar111 & (uint)fVar365;
  auVar284._4_4_ = ~uVar112 & (uint)fVar115;
  auVar284._8_4_ = ~uVar113 & (uint)fVar143;
  auVar284._12_4_ = ~uVar114 & (uint)fVar144;
  auVar284 = auVar284 | auVar394;
  uVar111 = -(uint)(fVar365 <= ABS(fVar261));
  uVar112 = -(uint)(fVar115 <= ABS(fVar273));
  uVar113 = -(uint)(fVar143 <= ABS(fVar275));
  uVar114 = -(uint)(fVar144 <= ABS(fVar355));
  auVar263._0_4_ = (uint)fVar261 & uVar111;
  auVar263._4_4_ = (uint)fVar273 & uVar112;
  auVar263._8_4_ = (uint)fVar275 & uVar113;
  auVar263._12_4_ = (uint)fVar355 & uVar114;
  auVar395._0_4_ = ~uVar111 & (uint)fVar365;
  auVar395._4_4_ = ~uVar112 & (uint)fVar115;
  auVar395._8_4_ = ~uVar113 & (uint)fVar143;
  auVar395._12_4_ = ~uVar114 & (uint)fVar144;
  auVar395 = auVar395 | auVar263;
  auVar235 = rcpps(_DAT_01f4bd50,auVar188);
  auVar236._0_4_ = auVar235._0_4_;
  auVar189._0_4_ = auVar188._0_4_ * auVar236._0_4_;
  fVar318 = auVar235._4_4_;
  auVar189._4_4_ = auVar188._4_4_ * fVar318;
  fVar319 = auVar235._8_4_;
  auVar189._8_4_ = auVar188._8_4_ * fVar319;
  fVar320 = auVar235._12_4_;
  auVar189._12_4_ = auVar188._12_4_ * fVar320;
  fVar337 = (1.0 - auVar189._0_4_) * auVar236._0_4_ + auVar236._0_4_;
  fVar318 = (1.0 - auVar189._4_4_) * fVar318 + fVar318;
  fVar319 = (1.0 - auVar189._8_4_) * fVar319 + fVar319;
  fVar320 = (1.0 - auVar189._12_4_) * fVar320 + fVar320;
  auVar190 = rcpps(auVar189,auVar284);
  fVar230 = auVar190._0_4_;
  fVar273 = auVar190._4_4_;
  fVar355 = auVar190._8_4_;
  fVar301 = auVar190._12_4_;
  fVar230 = (1.0 - auVar284._0_4_ * fVar230) * fVar230 + fVar230;
  fVar273 = (1.0 - auVar284._4_4_ * fVar273) * fVar273 + fVar273;
  fVar355 = (1.0 - auVar284._8_4_ * fVar355) * fVar355 + fVar355;
  fVar301 = (1.0 - auVar284._12_4_ * fVar301) * fVar301 + fVar301;
  auVar190 = rcpps(auVar190,auVar395);
  fVar261 = auVar190._0_4_;
  fVar275 = auVar190._4_4_;
  fVar280 = auVar190._8_4_;
  fVar305 = auVar190._12_4_;
  uVar9 = *(undefined8 *)(prim + uVar102 * 0x16 + 6);
  fVar261 = (1.0 - auVar395._0_4_ * fVar261) * fVar261 + fVar261;
  fVar275 = (1.0 - auVar395._4_4_ * fVar275) * fVar275 + fVar275;
  fVar280 = (1.0 - auVar395._8_4_ * fVar280) * fVar280 + fVar280;
  fVar305 = (1.0 - auVar395._12_4_ * fVar305) * fVar305 + fVar305;
  uVar103 = *(ulong *)(prim + uVar102 * 0x14 + 6);
  auVar239._0_12_ = auVar235._0_12_;
  auVar239._12_2_ = auVar235._6_2_;
  auVar239._14_2_ = (short)((ulong)uVar219 >> 0x30);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._0_10_ = auVar235._0_10_;
  auVar238._10_2_ = (short)((ulong)uVar219 >> 0x20);
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._0_8_ = auVar235._0_8_;
  auVar237._8_2_ = auVar235._4_2_;
  auVar236._8_8_ = auVar237._8_8_;
  sVar145 = (short)((ulong)uVar219 >> 0x10);
  auVar236._6_2_ = sVar145;
  auVar236._4_2_ = auVar235._2_2_;
  auVar240._0_4_ = (int)(short)uVar219;
  iVar146 = auVar236._4_4_ >> 0x10;
  auVar234._0_8_ = CONCAT44(iVar146,auVar240._0_4_);
  auVar234._8_4_ = auVar237._8_4_ >> 0x10;
  auVar285._0_4_ = (float)auVar240._0_4_;
  fVar335 = (float)iVar146;
  auVar282._0_8_ = CONCAT44(fVar335,auVar285._0_4_);
  auVar282._8_4_ = (float)auVar234._8_4_;
  auVar243._12_2_ = sVar145 >> 0xf;
  auVar243._0_12_ = auVar234;
  auVar243._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._0_10_ = auVar234._0_10_;
  auVar242._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = sVar145;
  auVar241._0_8_ = auVar234._0_8_;
  auVar240._8_8_ = auVar241._8_8_;
  auVar240._6_2_ = (short)((ulong)uVar6 >> 0x10);
  auVar240._4_2_ = (short)uVar219 >> 0xf;
  uVar219 = *(undefined8 *)(prim + uVar102 * 0x18 + 6);
  auVar288._12_2_ = (short)((uint)fVar335 >> 0x10);
  auVar288._0_12_ = auVar282;
  auVar288._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._0_10_ = auVar282._0_10_;
  auVar287._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = SUB42(fVar335,0);
  auVar286._0_8_ = auVar282._0_8_;
  auVar285._8_8_ = auVar286._8_8_;
  sVar145 = (short)((ulong)uVar7 >> 0x10);
  auVar285._6_2_ = sVar145;
  auVar285._4_2_ = (short)((uint)auVar285._0_4_ >> 0x10);
  auVar289._0_4_ = (int)(short)uVar7;
  iVar146 = auVar285._4_4_ >> 0x10;
  auVar283._0_8_ = CONCAT44(iVar146,auVar289._0_4_);
  auVar283._8_4_ = auVar286._8_4_ >> 0x10;
  auVar323._0_4_ = (float)auVar289._0_4_;
  fVar368 = (float)iVar146;
  auVar322._0_8_ = CONCAT44(fVar368,auVar323._0_4_);
  auVar322._8_4_ = (float)auVar283._8_4_;
  auVar292._12_2_ = sVar145 >> 0xf;
  auVar292._0_12_ = auVar283;
  auVar292._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._0_10_ = auVar283._0_10_;
  auVar291._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._8_2_ = sVar145;
  auVar290._0_8_ = auVar283._0_8_;
  auVar289._8_8_ = auVar290._8_8_;
  auVar289._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar289._4_2_ = (short)uVar7 >> 0xf;
  uVar142 = (undefined2)(uVar107 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar107;
  auVar169._12_2_ = uVar142;
  auVar169._14_2_ = uVar142;
  uVar142 = (undefined2)(uVar107 >> 0x20);
  auVar235._12_4_ = auVar169._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar107;
  auVar235._10_2_ = uVar142;
  auVar190._10_6_ = auVar235._10_6_;
  auVar190._8_2_ = uVar142;
  auVar190._0_8_ = uVar107;
  uVar142 = (undefined2)(uVar107 >> 0x10);
  auVar84._4_8_ = auVar190._8_8_;
  auVar84._2_2_ = uVar142;
  auVar84._0_2_ = uVar142;
  auVar117._0_4_ = (float)(int)(short)uVar107;
  fVar365 = (float)(auVar84._0_4_ >> 0x10);
  auVar116._0_8_ = CONCAT44(fVar365,auVar117._0_4_);
  auVar116._8_4_ = (float)(auVar190._8_4_ >> 0x10);
  auVar326._12_2_ = (short)((uint)fVar368 >> 0x10);
  auVar326._0_12_ = auVar322;
  auVar326._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar325._12_4_ = auVar326._12_4_;
  auVar325._0_10_ = auVar322._0_10_;
  auVar325._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar324._10_6_ = auVar325._10_6_;
  auVar324._8_2_ = SUB42(fVar368,0);
  auVar324._0_8_ = auVar322._0_8_;
  auVar323._8_8_ = auVar324._8_8_;
  auVar323._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar323._4_2_ = (short)((uint)auVar323._0_4_ >> 0x10);
  uVar213 = (undefined2)(uVar103 >> 0x30);
  auVar202._12_2_ = (short)((uint)fVar365 >> 0x10);
  auVar202._0_12_ = auVar116;
  auVar202._14_2_ = uVar213;
  auVar329._12_4_ = auVar202._12_4_;
  auVar329._0_10_ = auVar116._0_10_;
  uVar211 = (undefined2)(uVar103 >> 0x20);
  auVar329._10_2_ = uVar211;
  auVar118._10_6_ = auVar329._10_6_;
  auVar118._8_2_ = SUB42(fVar365,0);
  auVar118._0_8_ = auVar116._0_8_;
  auVar117._8_8_ = auVar118._8_8_;
  uVar142 = (undefined2)(uVar103 >> 0x10);
  auVar117._6_2_ = uVar142;
  auVar117._4_2_ = (short)((uint)auVar117._0_4_ >> 0x10);
  fVar115 = (float)(auVar117._4_4_ >> 0x10);
  fVar187 = (float)(auVar118._8_4_ >> 0x10);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar103;
  auVar193._12_2_ = uVar213;
  auVar193._14_2_ = (short)((ulong)uVar219 >> 0x30);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar103;
  auVar192._10_2_ = (short)((ulong)uVar219 >> 0x20);
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar211;
  auVar191._0_8_ = uVar103;
  auVar85._4_8_ = auVar191._8_8_;
  auVar85._2_2_ = (short)((ulong)uVar219 >> 0x10);
  auVar85._0_2_ = uVar142;
  uVar107 = *(ulong *)(prim + uVar102 * 0x1d + 6);
  uVar142 = (undefined2)(uVar107 >> 0x30);
  auVar121._8_4_ = 0;
  auVar121._0_8_ = uVar107;
  auVar121._12_2_ = uVar142;
  auVar121._14_2_ = uVar142;
  uVar142 = (undefined2)(uVar107 >> 0x20);
  auVar120._12_4_ = auVar121._12_4_;
  auVar120._8_2_ = 0;
  auVar120._0_8_ = uVar107;
  auVar120._10_2_ = uVar142;
  auVar119._10_6_ = auVar120._10_6_;
  auVar119._8_2_ = uVar142;
  auVar119._0_8_ = uVar107;
  uVar142 = (undefined2)(uVar107 >> 0x10);
  auVar86._4_8_ = auVar119._8_8_;
  auVar86._2_2_ = uVar142;
  auVar86._0_2_ = uVar142;
  fVar143 = (float)(auVar86._0_4_ >> 0x10);
  fVar212 = (float)(auVar119._8_4_ >> 0x10);
  uVar109 = *(ulong *)(prim + uVar102 * 0x21 + 6);
  uVar142 = (undefined2)(uVar109 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar109;
  auVar196._12_2_ = uVar142;
  auVar196._14_2_ = uVar142;
  uVar142 = (undefined2)(uVar109 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar109;
  auVar195._10_2_ = uVar142;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar142;
  auVar194._0_8_ = uVar109;
  uVar142 = (undefined2)(uVar109 >> 0x10);
  auVar87._4_8_ = auVar194._8_8_;
  auVar87._2_2_ = uVar142;
  auVar87._0_2_ = uVar142;
  uVar10 = *(ulong *)(prim + uVar102 * 0x1f + 6);
  uVar142 = (undefined2)(uVar10 >> 0x30);
  auVar124._8_4_ = 0;
  auVar124._0_8_ = uVar10;
  auVar124._12_2_ = uVar142;
  auVar124._14_2_ = uVar142;
  uVar142 = (undefined2)(uVar10 >> 0x20);
  auVar123._12_4_ = auVar124._12_4_;
  auVar123._8_2_ = 0;
  auVar123._0_8_ = uVar10;
  auVar123._10_2_ = uVar142;
  auVar122._10_6_ = auVar123._10_6_;
  auVar122._8_2_ = uVar142;
  auVar122._0_8_ = uVar10;
  uVar142 = (undefined2)(uVar10 >> 0x10);
  auVar88._4_8_ = auVar122._8_8_;
  auVar88._2_2_ = uVar142;
  auVar88._0_2_ = uVar142;
  fVar144 = (float)(auVar88._0_4_ >> 0x10);
  fVar214 = (float)(auVar122._8_4_ >> 0x10);
  uVar102 = *(ulong *)(prim + uVar102 * 0x23 + 6);
  uVar142 = (undefined2)(uVar102 >> 0x30);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar102;
  auVar199._12_2_ = uVar142;
  auVar199._14_2_ = uVar142;
  uVar142 = (undefined2)(uVar102 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar102;
  auVar198._10_2_ = uVar142;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar142;
  auVar197._0_8_ = uVar102;
  uVar142 = (undefined2)(uVar102 >> 0x10);
  auVar89._4_8_ = auVar197._8_8_;
  auVar89._2_2_ = uVar142;
  auVar89._0_2_ = uVar142;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar240._4_4_ >> 0x10) - fVar335) * fVar186 + fVar335) - fVar348) *
                fVar318,((((float)(int)(short)uVar6 - auVar285._0_4_) * fVar186 + auVar285._0_4_) -
                        fVar363) * fVar337);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - auVar282._8_4_) * fVar186 + auVar282._8_4_) - fVar231) *
       fVar319;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar238._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar238._12_4_ >> 0x10)) - fVar232) * fVar320;
  auVar293._0_4_ =
       ((((float)(int)(short)uVar8 - auVar323._0_4_) * fVar186 + auVar323._0_4_) - fVar363) *
       fVar337;
  auVar293._4_4_ =
       ((((float)(auVar289._4_4_ >> 0x10) - fVar368) * fVar186 + fVar368) - fVar348) * fVar318;
  auVar293._8_4_ =
       ((((float)(auVar290._8_4_ >> 0x10) - auVar322._8_4_) * fVar186 + auVar322._8_4_) - fVar231) *
       fVar319;
  auVar293._12_4_ =
       ((((float)(auVar291._12_4_ >> 0x10) - (float)(auVar287._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar287._12_4_ >> 0x10)) - fVar232) * fVar320;
  auVar327._0_8_ =
       CONCAT44(((((float)(auVar323._4_4_ >> 0x10) - fVar365) * fVar186 + fVar365) - fVar387) *
                fVar273,((((float)(int)(short)uVar9 - auVar117._0_4_) * fVar186 + auVar117._0_4_) -
                        fVar379) * fVar230);
  auVar327._8_4_ =
       ((((float)(auVar324._8_4_ >> 0x10) - auVar116._8_4_) * fVar186 + auVar116._8_4_) - fVar389) *
       fVar355;
  auVar327._12_4_ =
       ((((float)(auVar325._12_4_ >> 0x10) - (float)(auVar235._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar235._12_4_ >> 0x10)) - fVar391) * fVar301;
  auVar342._0_4_ =
       ((((float)(int)(short)uVar219 - (float)(int)(short)uVar103) * fVar186 +
        (float)(int)(short)uVar103) - fVar379) * fVar230;
  auVar342._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar115) * fVar186 + fVar115) - fVar387) * fVar273;
  auVar342._8_4_ =
       ((((float)(auVar191._8_4_ >> 0x10) - fVar187) * fVar186 + fVar187) - fVar389) * fVar355;
  auVar342._12_4_ =
       ((((float)(auVar192._12_4_ >> 0x10) - (float)(auVar329._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar329._12_4_ >> 0x10)) - fVar391) * fVar301;
  auVar357._0_8_ =
       CONCAT44(((((float)(auVar87._0_4_ >> 0x10) - fVar143) * fVar186 + fVar143) - fVar218) *
                fVar275,((((float)(int)(short)uVar109 - (float)(int)(short)uVar107) * fVar186 +
                         (float)(int)(short)uVar107) - fVar217) * fVar261);
  auVar357._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar212) * fVar186 + fVar212) - fVar228) * fVar280;
  auVar357._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar120._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar120._12_4_ >> 0x10)) - fVar229) * fVar305;
  auVar373._0_4_ =
       ((((float)(int)(short)uVar102 - (float)(int)(short)uVar10) * fVar186 +
        (float)(int)(short)uVar10) - fVar217) * fVar261;
  auVar373._4_4_ =
       ((((float)(auVar89._0_4_ >> 0x10) - fVar144) * fVar186 + fVar144) - fVar218) * fVar275;
  auVar373._8_4_ =
       ((((float)(auVar197._8_4_ >> 0x10) - fVar214) * fVar186 + fVar214) - fVar228) * fVar280;
  auVar373._12_4_ =
       ((((float)(auVar198._12_4_ >> 0x10) - (float)(auVar123._12_4_ >> 0x10)) * fVar186 +
        (float)(auVar123._12_4_ >> 0x10)) - fVar229) * fVar305;
  auVar200._8_4_ = auVar244._8_4_;
  auVar200._0_8_ = auVar244._0_8_;
  auVar200._12_4_ = auVar244._12_4_;
  auVar235 = minps(auVar200,auVar293);
  auVar125._8_4_ = auVar327._8_4_;
  auVar125._0_8_ = auVar327._0_8_;
  auVar125._12_4_ = auVar327._12_4_;
  auVar190 = minps(auVar125,auVar342);
  auVar235 = maxps(auVar235,auVar190);
  auVar126._8_4_ = auVar357._8_4_;
  auVar126._0_8_ = auVar357._0_8_;
  auVar126._12_4_ = auVar357._12_4_;
  auVar190 = minps(auVar126,auVar373);
  uVar106 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar165._4_4_ = uVar106;
  auVar165._0_4_ = uVar106;
  auVar165._8_4_ = uVar106;
  auVar165._12_4_ = uVar106;
  auVar190 = maxps(auVar190,auVar165);
  auVar190 = maxps(auVar235,auVar190);
  local_1c8 = auVar190._0_4_ * 0.99999964;
  fStack_1c4 = auVar190._4_4_ * 0.99999964;
  fStack_1c0 = auVar190._8_4_ * 0.99999964;
  fStack_1bc = auVar190._12_4_ * 0.99999964;
  auVar190 = maxps(auVar244,auVar293);
  auVar235 = maxps(auVar327,auVar342);
  auVar190 = minps(auVar190,auVar235);
  auVar235 = maxps(auVar357,auVar373);
  fVar365 = (ray->super_RayK<1>).tfar;
  auVar127._4_4_ = fVar365;
  auVar127._0_4_ = fVar365;
  auVar127._8_4_ = fVar365;
  auVar127._12_4_ = fVar365;
  auVar235 = minps(auVar235,auVar127);
  auVar190 = minps(auVar190,auVar235);
  auVar166._0_4_ = -(uint)(PVar11 != (Primitive)0x0 && local_1c8 <= auVar190._0_4_ * 1.0000004);
  auVar166._4_4_ = -(uint)(1 < (byte)PVar11 && fStack_1c4 <= auVar190._4_4_ * 1.0000004);
  auVar166._8_4_ = -(uint)(2 < (byte)PVar11 && fStack_1c0 <= auVar190._8_4_ * 1.0000004);
  auVar166._12_4_ = -(uint)(3 < (byte)PVar11 && fStack_1bc <= auVar190._12_4_ * 1.0000004);
  uVar106 = movmskps((int)unaff_RBP,auVar166);
  uVar107 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar106);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = prim;
LAB_003ccd82:
  if (uVar107 == 0) {
    return;
  }
  lVar108 = 0;
  if (uVar107 != 0) {
    for (; (uVar107 >> lVar108 & 1) == 0; lVar108 = lVar108 + 1) {
    }
  }
  uVar111 = *(uint *)(local_290 + lVar108 * 4 + 6);
  pGVar20 = (context->scene->geometries).items[*(uint *)(local_290 + 2)].ptr;
  fVar365 = pGVar20->fnumTimeSegments;
  fVar115 = (pGVar20->time_range).lower;
  fVar143 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar115) /
            ((pGVar20->time_range).upper - fVar115)) * fVar365;
  fVar115 = floorf(fVar143);
  fVar365 = fVar365 + -1.0;
  if (fVar365 <= fVar115) {
    fVar115 = fVar365;
  }
  fVar365 = 0.0;
  if (0.0 <= fVar115) {
    fVar365 = fVar115;
  }
  fVar143 = fVar143 - fVar365;
  local_350 = (ulong)uVar111;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            (ulong)uVar111 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar105 = (long)(int)fVar365 * 0x38;
  lVar22 = *(long *)(_Var21 + lVar105);
  lVar23 = *(long *)(_Var21 + 0x10 + lVar105);
  pfVar3 = (float *)(lVar22 + lVar23 * uVar103);
  fVar365 = *pfVar3;
  fVar115 = pfVar3[1];
  fVar144 = pfVar3[2];
  fVar187 = pfVar3[3];
  lVar108 = uVar103 + 1;
  pauVar4 = (undefined1 (*) [12])(lVar22 + lVar23 * lVar108);
  auVar71 = *pauVar4;
  fVar212 = *(float *)pauVar4[1];
  lVar1 = uVar103 + 2;
  pfVar3 = (float *)(lVar22 + lVar23 * lVar1);
  fVar214 = *pfVar3;
  fVar217 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar228 = pfVar3[3];
  lVar2 = uVar103 + 3;
  pfVar3 = (float *)(lVar22 + lVar23 * lVar2);
  fVar229 = *pfVar3;
  fVar186 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar261 = pfVar3[3];
  lVar22 = *(long *)&pGVar20[4].fnumTimeSegments;
  lVar23 = *(long *)(lVar22 + lVar105);
  lVar24 = *(long *)(lVar22 + 0x10 + lVar105);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar103);
  fVar273 = *pfVar3;
  fVar275 = pfVar3[1];
  fVar355 = pfVar3[2];
  fVar280 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar108);
  fVar301 = *pfVar3;
  fVar305 = pfVar3[1];
  fVar363 = pfVar3[2];
  fVar348 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar1);
  fVar231 = *pfVar3;
  fVar232 = pfVar3[1];
  fVar318 = pfVar3[2];
  fVar319 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar2);
  fVar320 = *pfVar3;
  fVar335 = pfVar3[1];
  fVar337 = pfVar3[2];
  fVar368 = pfVar3[3];
  fVar377 = *(float *)*pauVar4 * 0.0;
  fVar378 = *(float *)(*pauVar4 + 4) * 0.0;
  fVar379 = *(float *)(*pauVar4 + 8) * 0.0;
  fVar409 = (fVar214 * 0.5 + fVar229 * 0.0 + fVar377) - fVar365 * 0.5;
  fVar410 = (fVar217 * 0.5 + fVar186 * 0.0 + fVar378) - fVar115 * 0.5;
  fVar215 = (fVar218 * 0.5 + fVar230 * 0.0 + fVar379) - fVar144 * 0.5;
  fVar216 = (fVar228 * 0.5 + fVar261 * 0.0 + fVar212 * 0.0) - fVar187 * 0.5;
  fVar356 = (fVar231 * 0.5 + fVar320 * 0.0 + fVar301 * 0.0) - fVar273 * 0.5;
  fVar364 = (fVar232 * 0.5 + fVar335 * 0.0 + fVar305 * 0.0) - fVar275 * 0.5;
  fVar366 = (fVar318 * 0.5 + fVar337 * 0.0 + fVar363 * 0.0) - fVar355 * 0.5;
  fVar367 = (fVar319 * 0.5 + fVar368 * 0.0 + fVar348 * 0.0) - fVar280 * 0.5;
  fVar387 = fVar214 * 0.0 + fVar229 * -0.0 + *(float *)*pauVar4 + fVar365 * -0.0;
  fVar389 = fVar217 * 0.0 + fVar186 * -0.0 + *(float *)(*pauVar4 + 4) + fVar115 * -0.0;
  fVar391 = fVar218 * 0.0 + fVar230 * -0.0 + *(float *)(*pauVar4 + 8) + fVar144 * -0.0;
  fVar399 = fVar228 * 0.0 + fVar261 * -0.0 + fVar212 + fVar187 * -0.0;
  fVar380 = fVar231 * 0.0 + fVar320 * -0.0 + fVar301 + fVar273 * -0.0;
  fVar388 = fVar232 * 0.0 + fVar335 * -0.0 + fVar305 + fVar275 * -0.0;
  fVar390 = fVar318 * 0.0 + fVar337 * -0.0 + fVar363 + fVar355 * -0.0;
  fVar392 = fVar319 * 0.0 + fVar368 * -0.0 + fVar348 + fVar280 * -0.0;
  fVar377 = fVar229 * -0.0 + fVar214 + fVar377 + fVar365 * -0.0;
  fVar378 = fVar186 * -0.0 + fVar217 + fVar378 + fVar115 * -0.0;
  fVar379 = fVar230 * -0.0 + fVar218 + fVar379 + fVar144 * -0.0;
  fVar393 = fVar261 * -0.0 + fVar228 + fVar212 * 0.0 + fVar187 * -0.0;
  local_3f8._0_4_ = auVar71._0_4_;
  local_3f8._4_4_ = auVar71._4_4_;
  fStack_3f0 = auVar71._8_4_;
  fVar400 = fVar365 * 0.0 + ((fVar229 * 0.5 + fVar214 * 0.0) - (float)local_3f8._0_4_ * 0.5);
  fVar401 = fVar115 * 0.0 + ((fVar186 * 0.5 + fVar217 * 0.0) - (float)local_3f8._4_4_ * 0.5);
  fVar402 = fVar144 * 0.0 + ((fVar230 * 0.5 + fVar218 * 0.0) - fStack_3f0 * 0.5);
  fVar408 = fVar187 * 0.0 + ((fVar261 * 0.5 + fVar228 * 0.0) - fVar212 * 0.5);
  fVar212 = fVar320 * -0.0 + fVar231 + fVar301 * 0.0 + fVar273 * -0.0;
  fVar214 = fVar335 * -0.0 + fVar232 + fVar305 * 0.0 + fVar275 * -0.0;
  fVar217 = fVar337 * -0.0 + fVar318 + fVar363 * 0.0 + fVar355 * -0.0;
  fVar228 = fVar368 * -0.0 + fVar319 + fVar348 * 0.0 + fVar280 * -0.0;
  fVar365 = fVar273 * 0.0 + ((fVar320 * 0.5 + fVar231 * 0.0) - fVar301 * 0.5);
  fVar115 = fVar275 * 0.0 + ((fVar335 * 0.5 + fVar232 * 0.0) - fVar305 * 0.5);
  fVar144 = fVar355 * 0.0 + ((fVar337 * 0.5 + fVar318 * 0.0) - fVar363 * 0.5);
  fVar187 = fVar280 * 0.0 + ((fVar368 * 0.5 + fVar319 * 0.0) - fVar348 * 0.5);
  fVar348 = fVar410 * fVar380 - fVar388 * fVar409;
  fVar231 = fVar215 * fVar388 - fVar390 * fVar410;
  fVar232 = fVar409 * fVar390 - fVar380 * fVar215;
  fVar318 = fVar216 * fVar392 - fVar392 * fVar216;
  fVar261 = fVar410 * fVar356 - fVar364 * fVar409;
  fVar275 = fVar215 * fVar364 - fVar366 * fVar410;
  fVar355 = fVar409 * fVar366 - fVar356 * fVar215;
  fVar218 = fVar401 * fVar212 - fVar214 * fVar400;
  fVar229 = fVar402 * fVar214 - fVar217 * fVar401;
  fVar186 = fVar400 * fVar217 - fVar212 * fVar402;
  fVar230 = fVar408 * fVar228 - fVar228 * fVar408;
  fVar212 = fVar401 * fVar365 - fVar115 * fVar400;
  fVar214 = fVar402 * fVar115 - fVar144 * fVar401;
  fVar144 = fVar400 * fVar144 - fVar365 * fVar402;
  fVar301 = fVar232 * fVar232 + fVar231 * fVar231 + fVar348 * fVar348;
  auVar235 = ZEXT416((uint)fVar301);
  auVar190 = rsqrtss(ZEXT416((uint)fVar301),auVar235);
  fVar365 = auVar190._0_4_;
  fVar305 = fVar365 * 1.5 - fVar365 * fVar365 * fVar301 * 0.5 * fVar365;
  fVar319 = fVar348 * fVar261 + fVar232 * fVar355 + fVar231 * fVar275;
  fVar365 = fVar318 * fVar305;
  auVar190 = rcpss(auVar235,auVar235);
  fVar273 = (2.0 - fVar301 * auVar190._0_4_) * auVar190._0_4_;
  fVar280 = fVar186 * fVar186 + fVar229 * fVar229 + fVar218 * fVar218;
  auVar190 = ZEXT416((uint)fVar280);
  auVar235 = rsqrtss(ZEXT416((uint)fVar280),auVar190);
  fVar115 = auVar235._0_4_;
  fVar228 = fVar115 * 1.5 - fVar115 * fVar115 * fVar280 * 0.5 * fVar115;
  fVar363 = fVar218 * fVar212 + fVar186 * fVar144 + fVar229 * fVar214;
  fVar217 = fVar230 * fVar228;
  auVar190 = rcpss(auVar190,auVar190);
  fVar115 = (2.0 - fVar280 * auVar190._0_4_) * auVar190._0_4_;
  fVar281 = fVar399 * fVar231 * fVar305;
  fVar302 = fVar399 * fVar232 * fVar305;
  fVar303 = fVar399 * fVar348 * fVar305;
  fVar304 = fVar399 * fVar365;
  fVar340 = fVar387 - fVar281;
  fVar349 = fVar389 - fVar302;
  fVar351 = fVar391 - fVar303;
  fVar353 = fVar399 - fVar304;
  fVar321 = fVar399 * fVar273 * (fVar301 * fVar275 - fVar319 * fVar231) * fVar305 +
            fVar216 * fVar231 * fVar305;
  fVar336 = fVar399 * fVar273 * (fVar301 * fVar355 - fVar319 * fVar232) * fVar305 +
            fVar216 * fVar232 * fVar305;
  fVar338 = fVar399 * fVar273 * (fVar301 * fVar261 - fVar319 * fVar348) * fVar305 +
            fVar216 * fVar348 * fVar305;
  fVar339 = fVar399 * fVar273 * (fVar301 * (fVar216 * fVar367 - fVar367 * fVar216) -
                                fVar319 * fVar318) * fVar305 + fVar216 * fVar365;
  fVar281 = fVar281 + fVar387;
  fVar302 = fVar302 + fVar389;
  fVar303 = fVar303 + fVar391;
  fVar304 = fVar304 + fVar399;
  fVar387 = fVar393 * fVar229 * fVar228;
  fVar389 = fVar393 * fVar186 * fVar228;
  fVar391 = fVar393 * fVar218 * fVar228;
  fVar399 = fVar393 * fVar217;
  fVar392 = fVar377 - fVar387;
  fVar255 = fVar378 - fVar389;
  fVar257 = fVar379 - fVar391;
  fVar259 = fVar393 - fVar399;
  fVar356 = fVar393 * fVar115 * (fVar280 * fVar214 - fVar363 * fVar229) * fVar228 +
            fVar408 * fVar229 * fVar228;
  fVar364 = fVar393 * fVar115 * (fVar280 * fVar144 - fVar363 * fVar186) * fVar228 +
            fVar408 * fVar186 * fVar228;
  fVar367 = fVar393 * fVar115 * (fVar280 * fVar212 - fVar363 * fVar218) * fVar228 +
            fVar408 * fVar218 * fVar228;
  fVar388 = fVar393 * fVar115 * (fVar280 * (fVar408 * fVar187 - fVar187 * fVar408) -
                                fVar363 * fVar230) * fVar228 + fVar408 * fVar217;
  fVar387 = fVar387 + fVar377;
  fVar389 = fVar389 + fVar378;
  fVar391 = fVar391 + fVar379;
  fVar399 = fVar399 + fVar393;
  lVar23 = *(long *)(_Var21 + 0x38 + lVar105);
  lVar24 = *(long *)(_Var21 + 0x48 + lVar105);
  pfVar3 = (float *)(lVar23 + lVar24 * uVar103);
  fVar365 = *pfVar3;
  fVar115 = pfVar3[1];
  fVar144 = pfVar3[2];
  fVar187 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar108);
  fVar212 = *pfVar3;
  fVar214 = pfVar3[1];
  fVar217 = pfVar3[2];
  fVar218 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar1);
  fVar228 = *pfVar3;
  fVar229 = pfVar3[1];
  fVar186 = pfVar3[2];
  fVar230 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar24 * lVar2);
  fVar261 = *pfVar3;
  fVar273 = pfVar3[1];
  fVar275 = pfVar3[2];
  fVar355 = pfVar3[3];
  fVar233 = (fVar228 * 0.5 + fVar261 * 0.0 + fVar212 * 0.0) - fVar365 * 0.5;
  fVar256 = (fVar229 * 0.5 + fVar273 * 0.0 + fVar214 * 0.0) - fVar115 * 0.5;
  fVar258 = (fVar186 * 0.5 + fVar275 * 0.0 + fVar217 * 0.0) - fVar144 * 0.5;
  fVar260 = (fVar230 * 0.5 + fVar355 * 0.0 + fVar218 * 0.0) - fVar187 * 0.5;
  lVar23 = *(long *)(lVar22 + 0x38 + lVar105);
  lVar22 = *(long *)(lVar22 + 0x48 + lVar105);
  uVar103 = uVar103 * lVar22;
  pfVar3 = (float *)(lVar23 + lVar22 * lVar2);
  fVar280 = *pfVar3;
  fVar301 = pfVar3[1];
  fVar305 = pfVar3[2];
  fVar363 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar1 * lVar22);
  fVar348 = *pfVar3;
  fVar231 = pfVar3[1];
  fVar232 = pfVar3[2];
  fVar318 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + lVar108 * lVar22);
  fVar319 = *pfVar3;
  fVar320 = pfVar3[1];
  fVar335 = pfVar3[2];
  fVar337 = pfVar3[3];
  pfVar3 = (float *)(lVar23 + uVar103);
  fVar368 = *pfVar3;
  fVar377 = pfVar3[1];
  fVar378 = pfVar3[2];
  fVar379 = pfVar3[3];
  fVar341 = (fVar348 * 0.5 + fVar280 * 0.0 + fVar319 * 0.0) - fVar368 * 0.5;
  fVar350 = (fVar231 * 0.5 + fVar301 * 0.0 + fVar320 * 0.0) - fVar377 * 0.5;
  fVar352 = (fVar232 * 0.5 + fVar305 * 0.0 + fVar335 * 0.0) - fVar378 * 0.5;
  fVar354 = (fVar318 * 0.5 + fVar363 * 0.0 + fVar337 * 0.0) - fVar379 * 0.5;
  fVar393 = fVar228 * 0.0 + fVar261 * -0.0 + fVar212 + fVar365 * -0.0;
  fVar366 = fVar229 * 0.0 + fVar273 * -0.0 + fVar214 + fVar115 * -0.0;
  fVar380 = fVar186 * 0.0 + fVar275 * -0.0 + fVar217 + fVar144 * -0.0;
  fVar390 = fVar230 * 0.0 + fVar355 * -0.0 + fVar218 + fVar187 * -0.0;
  fVar262 = fVar261 * -0.0 + fVar228 + fVar212 * 0.0 + fVar365 * -0.0;
  fVar274 = fVar273 * -0.0 + fVar229 + fVar214 * 0.0 + fVar115 * -0.0;
  fVar276 = fVar275 * -0.0 + fVar186 + fVar217 * 0.0 + fVar144 * -0.0;
  fVar277 = fVar355 * -0.0 + fVar230 + fVar218 * 0.0 + fVar187 * -0.0;
  fVar261 = fVar365 * 0.0 + ((fVar261 * 0.5 + fVar228 * 0.0) - fVar212 * 0.5);
  fVar273 = fVar115 * 0.0 + ((fVar273 * 0.5 + fVar229 * 0.0) - fVar214 * 0.5);
  fVar275 = fVar144 * 0.0 + ((fVar275 * 0.5 + fVar186 * 0.0) - fVar217 * 0.5);
  fVar278 = fVar187 * 0.0 + ((fVar355 * 0.5 + fVar230 * 0.0) - fVar218 * 0.5);
  fVar217 = fVar348 * 0.0 + fVar280 * -0.0 + fVar319 + fVar368 * -0.0;
  fVar229 = fVar231 * 0.0 + fVar301 * -0.0 + fVar320 + fVar377 * -0.0;
  fVar186 = fVar232 * 0.0 + fVar305 * -0.0 + fVar335 + fVar378 * -0.0;
  fVar230 = fVar318 * 0.0 + fVar363 * -0.0 + fVar337 + fVar379 * -0.0;
  fVar365 = fVar280 * -0.0 + fVar348 + fVar319 * 0.0 + fVar368 * -0.0;
  fVar115 = fVar301 * -0.0 + fVar231 + fVar320 * 0.0 + fVar377 * -0.0;
  fVar212 = fVar305 * -0.0 + fVar232 + fVar335 * 0.0 + fVar378 * -0.0;
  fVar214 = fVar363 * -0.0 + fVar318 + fVar337 * 0.0 + fVar379 * -0.0;
  fVar228 = fVar368 * 0.0 + ((fVar280 * 0.5 + fVar348 * 0.0) - fVar319 * 0.5);
  fVar218 = fVar377 * 0.0 + ((fVar301 * 0.5 + fVar231 * 0.0) - fVar320 * 0.5);
  fVar280 = fVar378 * 0.0 + ((fVar305 * 0.5 + fVar232 * 0.0) - fVar335 * 0.5);
  fVar378 = fVar379 * 0.0 + ((fVar363 * 0.5 + fVar318 * 0.0) - fVar337 * 0.5);
  fVar319 = fVar256 * fVar217 - fVar229 * fVar233;
  fVar320 = fVar258 * fVar229 - fVar186 * fVar256;
  fVar335 = fVar233 * fVar186 - fVar217 * fVar258;
  fVar337 = fVar260 * fVar230 - fVar230 * fVar260;
  fVar355 = fVar256 * fVar341 - fVar350 * fVar233;
  fVar186 = fVar258 * fVar350 - fVar352 * fVar256;
  fVar230 = fVar233 * fVar352 - fVar341 * fVar258;
  fVar229 = fVar273 * fVar365 - fVar115 * fVar261;
  fVar305 = fVar275 * fVar115 - fVar212 * fVar273;
  fVar348 = fVar261 * fVar212 - fVar365 * fVar275;
  fVar232 = fVar278 * fVar214 - fVar214 * fVar278;
  fVar217 = fVar273 * fVar228 - fVar218 * fVar261;
  fVar218 = fVar275 * fVar218 - fVar280 * fVar273;
  fVar228 = fVar261 * fVar280 - fVar228 * fVar275;
  fVar214 = fVar335 * fVar335 + fVar320 * fVar320 + fVar319 * fVar319;
  auVar235 = ZEXT416((uint)fVar214);
  auVar190 = rsqrtss(ZEXT416((uint)fVar214),auVar235);
  fVar365 = auVar190._0_4_;
  fVar280 = fVar365 * 1.5 - fVar365 * fVar365 * fVar214 * 0.5 * fVar365;
  fVar365 = fVar319 * fVar355 + fVar335 * fVar230 + fVar320 * fVar186;
  auVar190 = rcpss(auVar235,auVar235);
  fVar115 = (2.0 - fVar214 * auVar190._0_4_) * auVar190._0_4_;
  fVar212 = fVar337 * fVar280;
  fVar379 = fVar348 * fVar348 + fVar305 * fVar305 + fVar229 * fVar229;
  auVar190 = ZEXT416((uint)fVar379);
  auVar235 = rsqrtss(ZEXT416((uint)fVar379),auVar190);
  fVar301 = auVar235._0_4_;
  fVar350 = fVar301 * 1.5 - fVar301 * fVar301 * fVar379 * 0.5 * fVar301;
  fVar352 = fVar229 * fVar217 + fVar348 * fVar228 + fVar305 * fVar218;
  auVar190 = rcpss(auVar190,auVar190);
  fVar369 = (2.0 - fVar379 * auVar190._0_4_) * auVar190._0_4_;
  fVar341 = fVar232 * fVar350;
  fVar301 = fVar390 * fVar320 * fVar280;
  fVar363 = fVar390 * fVar335 * fVar280;
  fVar231 = fVar390 * fVar319 * fVar280;
  fVar318 = fVar390 * fVar212;
  fVar186 = fVar390 * fVar115 * (fVar214 * fVar186 - fVar365 * fVar320) * fVar280 +
            fVar260 * fVar320 * fVar280;
  fVar230 = fVar390 * fVar115 * (fVar214 * fVar230 - fVar365 * fVar335) * fVar280 +
            fVar260 * fVar335 * fVar280;
  fVar355 = fVar390 * fVar115 * (fVar214 * fVar355 - fVar365 * fVar319) * fVar280 +
            fVar260 * fVar319 * fVar280;
  fVar280 = fVar390 * fVar115 * (fVar214 * (fVar260 * fVar354 - fVar354 * fVar260) -
                                fVar365 * fVar337) * fVar280 + fVar260 * fVar212;
  fVar319 = fVar393 - fVar301;
  fVar320 = fVar366 - fVar363;
  fVar335 = fVar380 - fVar231;
  fVar337 = fVar390 - fVar318;
  fVar301 = fVar301 + fVar393;
  fVar363 = fVar363 + fVar366;
  fVar231 = fVar231 + fVar380;
  fVar318 = fVar318 + fVar390;
  fVar365 = fVar277 * fVar305 * fVar350;
  fVar115 = fVar277 * fVar348 * fVar350;
  fVar212 = fVar277 * fVar229 * fVar350;
  fVar214 = fVar277 * fVar341;
  fVar305 = fVar277 * fVar369 * (fVar379 * fVar218 - fVar352 * fVar305) * fVar350 +
            fVar278 * fVar305 * fVar350;
  fVar368 = fVar277 * fVar369 * (fVar379 * fVar228 - fVar352 * fVar348) * fVar350 +
            fVar278 * fVar348 * fVar350;
  fVar377 = fVar277 * fVar369 * (fVar379 * fVar217 - fVar352 * fVar229) * fVar350 +
            fVar278 * fVar229 * fVar350;
  fVar232 = fVar277 * fVar369 * (fVar379 * (fVar278 * fVar378 - fVar378 * fVar278) -
                                fVar352 * fVar232) * fVar350 + fVar278 * fVar341;
  fVar217 = fVar262 - fVar365;
  fVar218 = fVar274 - fVar115;
  fVar228 = fVar276 - fVar212;
  fVar229 = fVar277 - fVar214;
  fVar365 = fVar365 + fVar262;
  fVar115 = fVar115 + fVar274;
  fVar212 = fVar212 + fVar276;
  fVar214 = fVar214 + fVar277;
  fVar348 = 1.0 - fVar143;
  local_388 = fVar340 * fVar348 + fVar319 * fVar143;
  fStack_384 = fVar349 * fVar348 + fVar320 * fVar143;
  fStack_380 = fVar351 * fVar348 + fVar335 * fVar143;
  fStack_37c = fVar353 * fVar348 + fVar337 * fVar143;
  local_398 = ((fVar409 - fVar321) * 0.33333334 + fVar340) * fVar348 +
              ((fVar233 - fVar186) * 0.33333334 + fVar319) * fVar143;
  fStack_394 = ((fVar410 - fVar336) * 0.33333334 + fVar349) * fVar348 +
               ((fVar256 - fVar230) * 0.33333334 + fVar320) * fVar143;
  fStack_390 = ((fVar215 - fVar338) * 0.33333334 + fVar351) * fVar348 +
               ((fVar258 - fVar355) * 0.33333334 + fVar335) * fVar143;
  fStack_38c = ((fVar216 - fVar339) * 0.33333334 + fVar353) * fVar348 +
               ((fVar260 - fVar280) * 0.33333334 + fVar337) * fVar143;
  local_3b8 = (fVar392 - (fVar400 - fVar356) * 0.33333334) * fVar348 +
              (fVar217 - (fVar261 - fVar305) * 0.33333334) * fVar143;
  fStack_3b4 = (fVar255 - (fVar401 - fVar364) * 0.33333334) * fVar348 +
               (fVar218 - (fVar273 - fVar368) * 0.33333334) * fVar143;
  fStack_3b0 = (fVar257 - (fVar402 - fVar367) * 0.33333334) * fVar348 +
               (fVar228 - (fVar275 - fVar377) * 0.33333334) * fVar143;
  fStack_3ac = (fVar259 - (fVar408 - fVar388) * 0.33333334) * fVar348 +
               (fVar229 - (fVar278 - fVar232) * 0.33333334) * fVar143;
  local_3a8 = fVar392 * fVar348 + fVar217 * fVar143;
  fStack_3a4 = fVar255 * fVar348 + fVar218 * fVar143;
  fStack_3a0 = fVar257 * fVar348 + fVar228 * fVar143;
  fStack_39c = fVar259 * fVar348 + fVar229 * fVar143;
  local_378 = fVar281 * fVar348 + fVar301 * fVar143;
  fStack_374 = fVar302 * fVar348 + fVar363 * fVar143;
  fStack_370 = fVar303 * fVar348 + fVar231 * fVar143;
  fStack_36c = fVar304 * fVar348 + fVar318 * fVar143;
  local_368 = ((fVar321 + fVar409) * 0.33333334 + fVar281) * fVar348 +
              ((fVar186 + fVar233) * 0.33333334 + fVar301) * fVar143;
  fStack_364 = ((fVar336 + fVar410) * 0.33333334 + fVar302) * fVar348 +
               ((fVar230 + fVar256) * 0.33333334 + fVar363) * fVar143;
  fStack_360 = ((fVar338 + fVar215) * 0.33333334 + fVar303) * fVar348 +
               ((fVar355 + fVar258) * 0.33333334 + fVar231) * fVar143;
  fStack_35c = ((fVar339 + fVar216) * 0.33333334 + fVar304) * fVar348 +
               ((fVar280 + fVar260) * 0.33333334 + fVar318) * fVar143;
  local_3cc.m128[1] =
       (fVar387 - (fVar356 + fVar400) * 0.33333334) * fVar348 +
       (fVar365 - (fVar305 + fVar261) * 0.33333334) * fVar143;
  local_3cc.m128[2] =
       (fVar389 - (fVar364 + fVar401) * 0.33333334) * fVar348 +
       (fVar115 - (fVar368 + fVar273) * 0.33333334) * fVar143;
  local_3cc.m128[3] =
       (fVar391 - (fVar367 + fVar402) * 0.33333334) * fVar348 +
       (fVar212 - (fVar377 + fVar275) * 0.33333334) * fVar143;
  fStack_3bc = (fVar399 - (fVar388 + fVar408) * 0.33333334) * fVar348 +
               (fVar214 - (fVar232 + fVar278) * 0.33333334) * fVar143;
  local_218 = fVar348 * fVar387 + fVar143 * fVar365;
  fStack_214 = fVar348 * fVar389 + fVar143 * fVar115;
  fStack_210 = fVar348 * fVar391 + fVar143 * fVar212;
  fStack_20c = fVar348 * fVar399 + fVar143 * fVar214;
  fVar365 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar115 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar143 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar212 = (pre->ray_space).vx.field_0.m128[0];
  fVar214 = (pre->ray_space).vx.field_0.m128[1];
  fVar217 = (pre->ray_space).vy.field_0.m128[0];
  fVar218 = (pre->ray_space).vy.field_0.m128[1];
  fVar228 = (pre->ray_space).vz.field_0.m128[0];
  fVar229 = (pre->ray_space).vz.field_0.m128[1];
  fVar301 = (local_388 - fVar365) * fVar212 +
            (fStack_384 - fVar115) * fVar217 + (fStack_380 - fVar143) * fVar228;
  fVar305 = (local_388 - fVar365) * fVar214 +
            (fStack_384 - fVar115) * fVar218 + (fStack_380 - fVar143) * fVar229;
  local_2c8._0_8_ = CONCAT44(fVar305,fVar301);
  fVar275 = (local_398 - fVar365) * fVar212 +
            (fStack_394 - fVar115) * fVar217 + (fStack_390 - fVar143) * fVar228;
  fVar355 = (local_398 - fVar365) * fVar214 +
            (fStack_394 - fVar115) * fVar218 + (fStack_390 - fVar143) * fVar229;
  local_2d8._0_8_ = CONCAT44(fVar355,fVar275);
  fVar186 = (local_3b8 - fVar365) * fVar212 +
            (fStack_3b4 - fVar115) * fVar217 + (fStack_3b0 - fVar143) * fVar228;
  fVar230 = (local_3b8 - fVar365) * fVar214 +
            (fStack_3b4 - fVar115) * fVar218 + (fStack_3b0 - fVar143) * fVar229;
  local_348 = CONCAT44(fVar230,fVar186);
  fVar261 = (local_3a8 - fVar365) * fVar212 +
            (fStack_3a4 - fVar115) * fVar217 + (fStack_3a0 - fVar143) * fVar228;
  fVar273 = (local_3a8 - fVar365) * fVar214 +
            (fStack_3a4 - fVar115) * fVar218 + (fStack_3a0 - fVar143) * fVar229;
  local_2e8 = CONCAT44(fVar273,fVar261);
  fVar280 = (local_378 - fVar365) * fVar212 +
            (fStack_374 - fVar115) * fVar217 + (fStack_370 - fVar143) * fVar228;
  fStack_2f4 = (local_378 - fVar365) * fVar214 +
               (fStack_374 - fVar115) * fVar218 + (fStack_370 - fVar143) * fVar229;
  fVar363 = (local_368 - fVar365) * fVar212 +
            (fStack_364 - fVar115) * fVar217 + (fStack_360 - fVar143) * fVar228;
  fVar348 = (local_368 - fVar365) * fVar214 +
            (fStack_364 - fVar115) * fVar218 + (fStack_360 - fVar143) * fVar229;
  local_308 = CONCAT44(fVar348,fVar363);
  local_2a8 = (local_3cc.m128[1] - fVar365) * fVar212 +
              (local_3cc.m128[2] - fVar115) * fVar217 + (local_3cc.m128[3] - fVar143) * fVar228;
  fStack_2a4 = (local_3cc.m128[1] - fVar365) * fVar214 +
               (local_3cc.m128[2] - fVar115) * fVar218 + (local_3cc.m128[3] - fVar143) * fVar229;
  fVar212 = (local_218 - fVar365) * fVar212 +
            (fStack_214 - fVar115) * fVar217 + (fStack_210 - fVar143) * fVar228;
  fVar365 = (local_218 - fVar365) * fVar214 +
            (fStack_214 - fVar115) * fVar218 + (fStack_210 - fVar143) * fVar229;
  local_328 = CONCAT44(fVar365,fVar212);
  auVar358._8_8_ = local_308;
  auVar358._0_8_ = local_2d8._0_8_;
  local_b8._8_8_ = local_328;
  local_b8._0_8_ = local_2e8;
  auVar128._8_4_ = fVar280;
  auVar128._0_8_ = local_2c8._0_8_;
  auVar128._12_4_ = fStack_2f4;
  auVar190 = minps(auVar128,auVar358);
  auVar167._8_4_ = local_2a8;
  auVar167._0_8_ = local_348;
  auVar167._12_4_ = fStack_2a4;
  auVar235 = minps(auVar167,local_b8);
  auVar190 = minps(auVar190,auVar235);
  auVar168._4_4_ = fVar305;
  auVar168._0_4_ = fVar301;
  auVar168._8_4_ = fVar280;
  auVar168._12_4_ = fStack_2f4;
  auVar235 = maxps(auVar168,auVar358);
  auVar201._4_4_ = fVar230;
  auVar201._0_4_ = fVar186;
  auVar201._8_4_ = local_2a8;
  auVar201._12_4_ = fStack_2a4;
  auVar202 = maxps(auVar201,local_b8);
  auVar169 = maxps(auVar235,auVar202);
  auVar28._4_8_ = auVar202._8_8_;
  auVar28._0_4_ = auVar190._4_4_;
  auVar203._0_8_ = auVar28._0_8_ << 0x20;
  auVar203._8_4_ = auVar190._8_4_;
  auVar203._12_4_ = auVar190._12_4_;
  auVar204._8_8_ = auVar190._8_8_;
  auVar204._0_8_ = auVar203._8_8_;
  auVar235 = minps(auVar190,auVar204);
  auVar29._4_8_ = auVar190._8_8_;
  auVar29._0_4_ = auVar169._4_4_;
  auVar205._0_8_ = auVar29._0_8_ << 0x20;
  auVar205._8_4_ = auVar169._8_4_;
  auVar205._12_4_ = auVar169._12_4_;
  auVar206._8_8_ = auVar169._8_8_;
  auVar206._0_8_ = auVar205._8_8_;
  auVar190 = maxps(auVar169,auVar206);
  auVar129._0_8_ = auVar235._0_8_ & 0x7fffffff7fffffff;
  auVar129._8_4_ = auVar235._8_4_ & 0x7fffffff;
  auVar129._12_4_ = auVar235._12_4_ & 0x7fffffff;
  auVar170._0_8_ = auVar190._0_8_ & 0x7fffffff7fffffff;
  auVar170._8_4_ = auVar190._8_4_ & 0x7fffffff;
  auVar170._12_4_ = auVar190._12_4_ & 0x7fffffff;
  auVar190 = maxps(auVar129,auVar170);
  fStack_c4 = auVar190._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar190._0_4_) {
    local_c8 = auVar190._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_2c8._8_8_ = local_2c8._0_8_;
  local_2d8._8_8_ = local_2d8._0_8_;
  uStack_340 = local_348;
  register0x00001388 = local_2e8;
  register0x00001548 = local_308;
  register0x00001348 = local_328;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  local_3d8 = CONCAT44(fStack_2f4,fVar280);
  local_88 = fVar275 - fVar301;
  fStack_84 = fVar355 - fVar305;
  fStack_80 = fVar363 - fVar280;
  fStack_7c = fVar348 - fStack_2f4;
  local_98 = fVar186 - fVar275;
  fStack_94 = fVar230 - fVar355;
  fStack_90 = local_2a8 - fVar363;
  fStack_8c = fStack_2a4 - fVar348;
  local_2b8 = local_348;
  uStack_2a0 = local_308;
  local_a8 = fVar261 - fVar186;
  fStack_a4 = fVar273 - fVar230;
  fStack_a0 = fVar212 - local_2a8;
  fStack_9c = fVar365 - fStack_2a4;
  local_188 = local_378 - local_388;
  fStack_184 = fStack_374 - fStack_384;
  fStack_180 = fStack_370 - fStack_380;
  fStack_17c = fStack_36c - fStack_37c;
  local_198 = local_368 - local_398;
  fStack_194 = fStack_364 - fStack_394;
  fStack_190 = fStack_360 - fStack_390;
  fStack_18c = fStack_35c - fStack_38c;
  local_1a8 = local_3cc.m128[1] - local_3b8;
  fStack_1a4 = local_3cc.m128[2] - fStack_3b4;
  fStack_1a0 = local_3cc.m128[3] - fStack_3b0;
  fStack_19c = fStack_3bc - fStack_3ac;
  local_1b8 = local_218 - local_3a8;
  fStack_1b4 = fStack_214 - fStack_3a4;
  fStack_1b0 = fStack_210 - fStack_3a0;
  fStack_1ac = fStack_20c - fStack_39c;
  uVar109 = 0;
  local_418._0_4_ = 0.0;
  local_418._4_4_ = 1.0;
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  fVar143 = 0.0;
  fVar212 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  local_2f8 = fVar280;
  fStack_2f0 = fVar280;
  fStack_2ec = fStack_2f4;
  local_318 = local_2a8;
  fStack_314 = fStack_2a4;
  fStack_310 = local_2a8;
  fStack_30c = fStack_2a4;
  fVar365 = fVar186;
  fVar115 = fVar230;
LAB_003cdb10:
  fVar214 = 1.0 - (float)local_418._0_4_;
  fVar217 = 1.0 - (float)local_418._0_4_;
  fVar218 = 1.0 - (float)local_418._4_4_;
  fVar228 = 1.0 - (float)local_418._4_4_;
  fVar363 = local_2c8._0_4_ * fVar214 + local_2f8 * (float)local_418._0_4_;
  fVar320 = local_2c8._4_4_ * fVar217 + fStack_2f4 * (float)local_418._0_4_;
  fVar335 = local_2c8._8_4_ * fVar218 + fStack_2f0 * (float)local_418._4_4_;
  fVar377 = local_2c8._12_4_ * fVar228 + fStack_2ec * (float)local_418._4_4_;
  fVar229 = local_2d8._0_4_ * fVar214 + local_308._0_4_ * (float)local_418._0_4_;
  fVar232 = local_2d8._4_4_ * fVar217 + local_308._4_4_ * (float)local_418._0_4_;
  fVar318 = local_2d8._8_4_ * fVar218 + local_308._8_4_ * (float)local_418._4_4_;
  fVar319 = local_2d8._12_4_ * fVar228 + local_308._12_4_ * (float)local_418._4_4_;
  fVar399 = fVar186 * fVar214 + local_318 * (float)local_418._0_4_;
  fVar400 = fVar230 * fVar217 + fStack_314 * (float)local_418._0_4_;
  fVar401 = fVar365 * fVar218 + fStack_310 * (float)local_418._4_4_;
  fVar402 = fVar115 * fVar228 + fStack_30c * (float)local_418._4_4_;
  fVar337 = fVar214 * local_2e8._0_4_ + (float)local_418._0_4_ * local_328._0_4_;
  fVar368 = fVar217 * local_2e8._4_4_ + (float)local_418._0_4_ * local_328._4_4_;
  fVar378 = fVar218 * local_2e8._8_4_ + (float)local_418._4_4_ * local_328._8_4_;
  fVar379 = fVar228 * local_2e8._12_4_ + (float)local_418._4_4_ * local_328._12_4_;
  fVar387 = (fVar212 - fVar143) * 0.11111111;
  local_428 = CONCAT44(fVar212,fVar143);
  fVar389 = (fVar212 - fVar143) * 0.0 + fVar143;
  fVar391 = (fVar212 - fVar143) * 0.33333334 + fVar143;
  fVar393 = (fVar212 - fVar143) * 0.6666667 + fVar143;
  fVar143 = (fVar212 - fVar143) * 1.0 + fVar143;
  fVar365 = 1.0 - fVar389;
  fVar115 = 1.0 - fVar391;
  fVar212 = 1.0 - fVar393;
  fVar228 = 1.0 - fVar143;
  fVar186 = fVar229 * fVar365 + fVar399 * fVar389;
  fVar230 = fVar229 * fVar115 + fVar399 * fVar391;
  fVar261 = fVar229 * fVar212 + fVar399 * fVar393;
  fVar273 = fVar229 * fVar228 + fVar399 * fVar143;
  fVar275 = fVar232 * fVar365 + fVar400 * fVar389;
  fVar355 = fVar232 * fVar115 + fVar400 * fVar391;
  fVar301 = fVar232 * fVar212 + fVar400 * fVar393;
  fVar305 = fVar232 * fVar228 + fVar400 * fVar143;
  fVar214 = (fVar363 * fVar365 + fVar229 * fVar389) * fVar365 + fVar389 * fVar186;
  fVar217 = (fVar363 * fVar115 + fVar229 * fVar391) * fVar115 + fVar391 * fVar230;
  fVar218 = (fVar363 * fVar212 + fVar229 * fVar393) * fVar212 + fVar393 * fVar261;
  fVar229 = (fVar363 * fVar228 + fVar229 * fVar143) * fVar228 + fVar143 * fVar273;
  fVar363 = (fVar320 * fVar365 + fVar232 * fVar389) * fVar365 + fVar389 * fVar275;
  fVar348 = (fVar320 * fVar115 + fVar232 * fVar391) * fVar115 + fVar391 * fVar355;
  fVar231 = (fVar320 * fVar212 + fVar232 * fVar393) * fVar212 + fVar393 * fVar301;
  fVar232 = (fVar320 * fVar228 + fVar232 * fVar143) * fVar228 + fVar143 * fVar305;
  fVar186 = fVar186 * fVar365 + (fVar399 * fVar365 + fVar337 * fVar389) * fVar389;
  fVar230 = fVar230 * fVar115 + (fVar399 * fVar115 + fVar337 * fVar391) * fVar391;
  fVar261 = fVar261 * fVar212 + (fVar399 * fVar212 + fVar337 * fVar393) * fVar393;
  fVar273 = fVar273 * fVar228 + (fVar399 * fVar228 + fVar337 * fVar143) * fVar143;
  fVar275 = fVar275 * fVar365 + (fVar400 * fVar365 + fVar368 * fVar389) * fVar389;
  fVar355 = fVar355 * fVar115 + (fVar400 * fVar115 + fVar368 * fVar391) * fVar391;
  fVar301 = fVar301 * fVar212 + (fVar400 * fVar212 + fVar368 * fVar393) * fVar393;
  fVar305 = fVar305 * fVar228 + (fVar400 * fVar228 + fVar368 * fVar143) * fVar143;
  local_258 = fVar365 * fVar214 + fVar389 * fVar186;
  fStack_254 = fVar115 * fVar217 + fVar391 * fVar230;
  fStack_250 = fVar212 * fVar218 + fVar393 * fVar261;
  fStack_24c = fVar228 * fVar229 + fVar143 * fVar273;
  local_148 = fVar365 * fVar363 + fVar389 * fVar275;
  fStack_144 = fVar115 * fVar348 + fVar391 * fVar355;
  fStack_140 = fVar212 * fVar231 + fVar393 * fVar301;
  fStack_13c = fVar228 * fVar232 + fVar143 * fVar305;
  fVar217 = (fVar230 - fVar217) * 3.0 * fVar387;
  fVar218 = (fVar261 - fVar218) * 3.0 * fVar387;
  fVar229 = (fVar273 - fVar229) * 3.0 * fVar387;
  fVar230 = (fVar355 - fVar348) * 3.0 * fVar387;
  fVar261 = (fVar301 - fVar231) * 3.0 * fVar387;
  fVar273 = (fVar305 - fVar232) * 3.0 * fVar387;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar186 - fVar214) * 3.0 * fVar387;
  fStack_234 = fStack_254 + fVar217;
  fStack_230 = fStack_250 + fVar218;
  fStack_22c = fStack_24c + fVar229;
  local_338._0_4_ = local_148 + (fVar275 - fVar363) * 3.0 * fVar387;
  local_338._4_4_ = fStack_144 + fVar230;
  fStack_330 = fStack_140 + fVar261;
  fStack_32c = fStack_13c + fVar273;
  local_248._0_4_ = fStack_254 - fVar217;
  local_248._4_4_ = fStack_250 - fVar218;
  local_248._8_4_ = fStack_24c - fVar229;
  local_248._12_4_ = 0;
  auVar130._0_4_ = fStack_144 - fVar230;
  auVar130._4_4_ = fStack_140 - fVar261;
  auVar130._8_4_ = fStack_13c - fVar273;
  auVar130._12_4_ = 0;
  fVar214 = fVar318 * fVar365 + fVar401 * fVar389;
  fVar217 = fVar318 * fVar115 + fVar401 * fVar391;
  fVar218 = fVar318 * fVar212 + fVar401 * fVar393;
  fVar229 = fVar318 * fVar228 + fVar401 * fVar143;
  fVar186 = fVar319 * fVar365 + fVar402 * fVar389;
  fVar230 = fVar319 * fVar115 + fVar402 * fVar391;
  fVar261 = fVar319 * fVar212 + fVar402 * fVar393;
  fVar320 = fVar319 * fVar228 + fVar402 * fVar143;
  fVar273 = (fVar335 * fVar365 + fVar318 * fVar389) * fVar365 + fVar389 * fVar214;
  fVar275 = (fVar335 * fVar115 + fVar318 * fVar391) * fVar115 + fVar391 * fVar217;
  fVar355 = (fVar335 * fVar212 + fVar318 * fVar393) * fVar212 + fVar393 * fVar218;
  fVar301 = (fVar335 * fVar228 + fVar318 * fVar143) * fVar228 + fVar143 * fVar229;
  fVar335 = (fVar377 * fVar365 + fVar319 * fVar389) * fVar365 + fVar389 * fVar186;
  fVar337 = (fVar377 * fVar115 + fVar319 * fVar391) * fVar115 + fVar391 * fVar230;
  fVar368 = (fVar377 * fVar212 + fVar319 * fVar393) * fVar212 + fVar393 * fVar261;
  fVar377 = (fVar377 * fVar228 + fVar319 * fVar143) * fVar228 + fVar143 * fVar320;
  fVar305 = fVar214 * fVar365 + (fVar401 * fVar365 + fVar378 * fVar389) * fVar389;
  fVar363 = fVar217 * fVar115 + (fVar401 * fVar115 + fVar378 * fVar391) * fVar391;
  fVar348 = fVar218 * fVar212 + (fVar401 * fVar212 + fVar378 * fVar393) * fVar393;
  fVar231 = fVar229 * fVar228 + (fVar401 * fVar228 + fVar378 * fVar143) * fVar143;
  fVar232 = fVar186 * fVar365 + (fVar402 * fVar365 + fVar379 * fVar389) * fVar389;
  fVar318 = fVar230 * fVar115 + (fVar402 * fVar115 + fVar379 * fVar391) * fVar391;
  fVar319 = fVar261 * fVar212 + (fVar402 * fVar212 + fVar379 * fVar393) * fVar393;
  fVar320 = fVar320 * fVar228 + (fVar402 * fVar228 + fVar379 * fVar143) * fVar143;
  fVar229 = fVar365 * fVar273 + fVar389 * fVar305;
  fVar186 = fVar115 * fVar275 + fVar391 * fVar363;
  fVar230 = fVar212 * fVar355 + fVar393 * fVar348;
  fVar261 = fVar228 * fVar301 + fVar143 * fVar231;
  fVar214 = fVar365 * fVar335 + fVar389 * fVar232;
  fVar217 = fVar115 * fVar337 + fVar391 * fVar318;
  fVar218 = fVar212 * fVar368 + fVar393 * fVar319;
  fVar228 = fVar228 * fVar377 + fVar143 * fVar320;
  fVar365 = (fVar363 - fVar275) * 3.0 * fVar387;
  fVar115 = (fVar348 - fVar355) * 3.0 * fVar387;
  fVar143 = (fVar231 - fVar301) * 3.0 * fVar387;
  fVar212 = (fVar318 - fVar337) * 3.0 * fVar387;
  fVar275 = (fVar319 - fVar368) * 3.0 * fVar387;
  fVar355 = (fVar320 - fVar377) * 3.0 * fVar387;
  local_f8._4_4_ = fVar230;
  local_f8._0_4_ = fVar186;
  local_f8._8_4_ = fVar261;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar218;
  local_118._0_4_ = fVar217;
  local_118._8_4_ = fVar228;
  local_118._12_4_ = 0;
  local_138 = fVar229 + (fVar305 - fVar273) * 3.0 * fVar387;
  fStack_134 = fVar186 + fVar365;
  fStack_130 = fVar230 + fVar115;
  fStack_12c = fVar261 + fVar143;
  local_108 = fVar214 + (fVar232 - fVar335) * 3.0 * fVar387;
  fStack_104 = fVar217 + fVar212;
  fStack_100 = fVar218 + fVar275;
  fStack_fc = fVar228 + fVar355;
  local_d8._0_4_ = fVar186 - fVar365;
  local_d8._4_4_ = fVar230 - fVar115;
  local_d8._8_4_ = fVar261 - fVar143;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar217 - fVar212;
  local_128._4_4_ = fVar218 - fVar275;
  local_128._8_4_ = fVar228 - fVar355;
  local_128._12_4_ = 0;
  fVar365 = (fVar186 - fStack_254) + (fVar229 - local_258);
  fVar115 = (fVar230 - fStack_250) + (fVar186 - fStack_254);
  fVar143 = (fVar261 - fStack_24c) + (fVar230 - fStack_250);
  fVar212 = (fVar261 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar273 = (fVar217 - fStack_144) + (fVar214 - local_148);
  fVar275 = (fVar218 - fStack_140) + (fVar217 - fStack_144);
  fVar355 = (fVar228 - fStack_13c) + (fVar218 - fStack_140);
  fVar301 = (fVar228 - fStack_13c) + 0.0;
  auVar294._0_8_ =
       CONCAT44(fStack_144 * fVar115 - fStack_254 * fVar275,
                local_148 * fVar365 - local_258 * fVar273);
  auVar294._8_4_ = fStack_140 * fVar143 - fStack_250 * fVar355;
  auVar294._12_4_ = fStack_13c * fVar212 - fStack_24c * fVar301;
  auVar245._0_4_ = (float)local_338._0_4_ * fVar365 - local_238 * fVar273;
  auVar245._4_4_ = (float)local_338._4_4_ * fVar115 - fStack_234 * fVar275;
  auVar245._8_4_ = fStack_330 * fVar143 - fStack_230 * fVar355;
  auVar245._12_4_ = fStack_32c * fVar212 - fStack_22c * fVar301;
  auVar264._0_8_ =
       CONCAT44(auVar130._4_4_ * fVar115 - fVar275 * local_248._4_4_,
                auVar130._0_4_ * fVar365 - fVar273 * local_248._0_4_);
  auVar264._8_4_ = auVar130._8_4_ * fVar143 - fVar355 * local_248._8_4_;
  auVar264._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
  auVar374._0_4_ = fVar365 * fStack_144 - fVar273 * fStack_254;
  auVar374._4_4_ = fVar115 * fStack_140 - fVar275 * fStack_250;
  auVar374._8_4_ = fVar143 * fStack_13c - fVar355 * fStack_24c;
  auVar374._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
  auVar328._0_8_ =
       CONCAT44(fVar217 * fVar115 - fVar186 * fVar275,fVar214 * fVar365 - fVar229 * fVar273);
  auVar328._8_4_ = fVar218 * fVar143 - fVar230 * fVar355;
  auVar328._12_4_ = fVar228 * fVar212 - fVar261 * fVar301;
  auVar385._0_4_ = local_108 * fVar365 - local_138 * fVar273;
  auVar385._4_4_ = fStack_104 * fVar115 - fStack_134 * fVar275;
  auVar385._8_4_ = fStack_100 * fVar143 - fStack_130 * fVar355;
  auVar385._12_4_ = fStack_fc * fVar212 - fStack_12c * fVar301;
  auVar309._0_8_ =
       CONCAT44(local_128._4_4_ * fVar115 - fVar275 * local_d8._4_4_,
                local_128._0_4_ * fVar365 - fVar273 * local_d8._0_4_);
  auVar309._8_4_ = local_128._8_4_ * fVar143 - fVar355 * local_d8._8_4_;
  auVar309._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
  auVar133._0_4_ = fVar365 * fVar217 - fVar273 * fVar186;
  auVar133._4_4_ = fVar115 * fVar218 - fVar275 * fVar230;
  auVar133._8_4_ = fVar143 * fVar228 - fVar355 * fVar261;
  auVar133._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
  auVar171._8_4_ = auVar294._8_4_;
  auVar171._0_8_ = auVar294._0_8_;
  auVar171._12_4_ = auVar294._12_4_;
  auVar190 = minps(auVar171,auVar245);
  auVar169 = maxps(auVar294,auVar245);
  auVar246._8_4_ = auVar264._8_4_;
  auVar246._0_8_ = auVar264._0_8_;
  auVar246._12_4_ = auVar264._12_4_;
  auVar235 = minps(auVar246,auVar374);
  auVar190 = minps(auVar190,auVar235);
  auVar235 = maxps(auVar264,auVar374);
  auVar202 = maxps(auVar169,auVar235);
  auVar247._8_4_ = auVar328._8_4_;
  auVar247._0_8_ = auVar328._0_8_;
  auVar247._12_4_ = auVar328._12_4_;
  auVar235 = minps(auVar247,auVar385);
  auVar329 = maxps(auVar328,auVar385);
  auVar265._8_4_ = auVar309._8_4_;
  auVar265._0_8_ = auVar309._0_8_;
  auVar265._12_4_ = auVar309._12_4_;
  auVar169 = minps(auVar265,auVar133);
  auVar235 = minps(auVar235,auVar169);
  auVar190 = minps(auVar190,auVar235);
  auVar235 = maxps(auVar309,auVar133);
  auVar235 = maxps(auVar329,auVar235);
  auVar235 = maxps(auVar202,auVar235);
  bVar110 = auVar190._4_4_ <= fStack_154;
  bVar26 = auVar190._8_4_ <= fStack_150;
  bVar27 = auVar190._12_4_ <= fStack_14c;
  auVar91._4_4_ = -(uint)bVar26;
  auVar91._0_4_ = -(uint)bVar110;
  auVar91._8_4_ = -(uint)bVar27;
  auVar91._12_4_ = 0;
  auVar175 = auVar91 << 0x20;
  auVar295._0_4_ =
       -(uint)(local_168 <= auVar235._0_4_ && auVar190._0_4_ <= local_158) & local_178._0_4_;
  auVar295._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar110) & local_178._4_4_;
  auVar295._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar26) & local_178._8_4_;
  auVar295._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar27) & local_178._12_4_;
  uVar111 = movmskps((int)uVar103,auVar295);
  paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar111;
  if (uVar111 != 0) {
    fVar365 = (fVar186 - fVar229) + (fStack_254 - local_258);
    fVar115 = (fVar230 - fVar186) + (fStack_250 - fStack_254);
    fVar143 = (fVar261 - fVar230) + (fStack_24c - fStack_250);
    fVar212 = (0.0 - fVar261) + (0.0 - fStack_24c);
    fVar273 = (fVar217 - fVar214) + (fStack_144 - local_148);
    fVar275 = (fVar218 - fVar217) + (fStack_140 - fStack_144);
    fVar355 = (fVar228 - fVar218) + (fStack_13c - fStack_140);
    fVar301 = (0.0 - fVar228) + (0.0 - fStack_13c);
    auVar396._0_8_ =
         CONCAT44(fStack_144 * fVar115 - fStack_254 * fVar275,
                  local_148 * fVar365 - local_258 * fVar273);
    auVar396._8_4_ = fStack_140 * fVar143 - fStack_250 * fVar355;
    auVar396._12_4_ = fStack_13c * fVar212 - fStack_24c * fVar301;
    auVar248._0_4_ = (float)local_338._0_4_ * fVar365 - local_238 * fVar273;
    auVar248._4_4_ = (float)local_338._4_4_ * fVar115 - fStack_234 * fVar275;
    auVar248._8_4_ = fStack_330 * fVar143 - fStack_230 * fVar355;
    auVar248._12_4_ = fStack_32c * fVar212 - fStack_22c * fVar301;
    auVar310._0_8_ =
         CONCAT44(auVar130._4_4_ * fVar115 - local_248._4_4_ * fVar275,
                  auVar130._0_4_ * fVar365 - local_248._0_4_ * fVar273);
    auVar310._8_4_ = auVar130._8_4_ * fVar143 - local_248._8_4_ * fVar355;
    auVar310._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
    auVar266._0_4_ = fStack_144 * fVar365 - fStack_254 * fVar273;
    auVar266._4_4_ = fStack_140 * fVar115 - fStack_250 * fVar275;
    auVar266._8_4_ = fStack_13c * fVar143 - fStack_24c * fVar355;
    auVar266._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
    auVar207._0_8_ =
         CONCAT44(fVar217 * fVar115 - fVar186 * fVar275,fVar214 * fVar365 - fVar229 * fVar273);
    auVar207._8_4_ = fVar218 * fVar143 - fVar230 * fVar355;
    auVar207._12_4_ = fVar228 * fVar212 - fVar261 * fVar301;
    auVar343._0_4_ = local_108 * fVar365 - local_138 * fVar273;
    auVar343._4_4_ = fStack_104 * fVar115 - fStack_134 * fVar275;
    auVar343._8_4_ = fStack_100 * fVar143 - fStack_130 * fVar355;
    auVar343._12_4_ = fStack_fc * fVar212 - fStack_12c * fVar301;
    auVar375._0_8_ =
         CONCAT44(local_128._4_4_ * fVar115 - local_d8._4_4_ * fVar275,
                  local_128._0_4_ * fVar365 - local_d8._0_4_ * fVar273);
    auVar375._8_4_ = local_128._8_4_ * fVar143 - local_d8._8_4_ * fVar355;
    auVar375._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
    auVar133._0_4_ = fVar365 * fVar217 - fVar273 * fVar186;
    auVar133._4_4_ = fVar115 * fVar218 - fVar275 * fVar230;
    auVar133._8_4_ = fVar143 * fVar228 - fVar355 * fVar261;
    auVar133._12_4_ = fVar212 * 0.0 - fVar301 * 0.0;
    auVar172._8_4_ = auVar396._8_4_;
    auVar172._0_8_ = auVar396._0_8_;
    auVar172._12_4_ = auVar396._12_4_;
    auVar190 = minps(auVar172,auVar248);
    auVar169 = maxps(auVar396,auVar248);
    auVar249._8_4_ = auVar310._8_4_;
    auVar249._0_8_ = auVar310._0_8_;
    auVar249._12_4_ = auVar310._12_4_;
    auVar235 = minps(auVar249,auVar266);
    auVar190 = minps(auVar190,auVar235);
    auVar235 = maxps(auVar310,auVar266);
    auVar329 = maxps(auVar169,auVar235);
    auVar250._8_4_ = auVar207._8_4_;
    auVar250._0_8_ = auVar207._0_8_;
    auVar250._12_4_ = auVar207._12_4_;
    auVar169 = minps(auVar250,auVar343);
    auVar235 = maxps(auVar207,auVar343);
    auVar267._8_4_ = auVar375._8_4_;
    auVar267._0_8_ = auVar375._0_8_;
    auVar267._12_4_ = auVar375._12_4_;
    auVar202 = minps(auVar267,auVar133);
    auVar169 = minps(auVar169,auVar202);
    auVar190 = minps(auVar190,auVar169);
    auVar169 = maxps(auVar375,auVar133);
    auVar235 = maxps(auVar235,auVar169);
    auVar235 = maxps(auVar329,auVar235);
    bVar110 = auVar190._4_4_ <= fStack_154;
    bVar26 = auVar190._8_4_ <= fStack_150;
    bVar27 = auVar190._12_4_ <= fStack_14c;
    auVar92._4_4_ = -(uint)bVar26;
    auVar92._0_4_ = -(uint)bVar110;
    auVar92._8_4_ = -(uint)bVar27;
    auVar92._12_4_ = 0;
    auVar175 = auVar92 << 0x20;
    auVar397._0_4_ =
         -(uint)(local_168 <= auVar235._0_4_ && auVar190._0_4_ <= local_158) & auVar295._0_4_;
    auVar397._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar110) & auVar295._4_4_;
    auVar397._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar26) & auVar295._8_4_;
    auVar397._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar27) & auVar295._12_4_;
    uVar111 = movmskps(uVar111,auVar397);
    paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar111;
    auVar385 = local_118;
    if (uVar111 != 0) {
      auStack_208[uVar109] = uVar111 & 0xff;
      *(undefined8 *)(afStack_78 + uVar109 * 2) = local_428;
      *(undefined1 (*) [8])(afStack_58 + uVar109 * 2) = local_418;
      uVar109 = (ulong)((int)uVar109 + 1);
      paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar111;
      auVar133 = _local_418;
    }
  }
LAB_003ce177:
  _local_3f8 = auVar130;
  auVar190 = _local_3f8;
  if ((int)uVar109 == 0) {
    fVar365 = (ray->super_RayK<1>).tfar;
    auVar180._4_4_ = -(uint)(fStack_1c4 <= fVar365);
    auVar180._0_4_ = -(uint)(local_1c8 <= fVar365);
    auVar180._8_4_ = -(uint)(fStack_1c0 <= fVar365);
    auVar180._12_4_ = -(uint)(fStack_1bc <= fVar365);
    uVar111 = movmskps((int)paVar104,auVar180);
    uVar107 = (ulong)((uint)uVar107 & (uint)uVar107 + 0xf & uVar111);
    goto LAB_003ccd82;
  }
  uVar112 = (int)uVar109 - 1;
  uVar103 = (ulong)uVar112;
  uVar111 = auStack_208[uVar103];
  local_418._0_4_ = afStack_58[uVar103 * 2];
  local_418._4_4_ = afStack_58[uVar103 * 2 + 1];
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  uVar10 = 0;
  if (uVar111 != 0) {
    for (; (uVar111 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar111 = uVar111 - 1 & uVar111;
  auStack_208[uVar103] = uVar111;
  if (uVar111 == 0) {
    uVar109 = (ulong)uVar112;
  }
  fVar212 = (float)(uVar10 + 1) * 0.33333334;
  fVar214 = auVar133._4_4_ * 0.0;
  fVar217 = auVar175._4_4_ * 0.0;
  fVar365 = afStack_78[uVar103 * 2];
  fVar115 = afStack_78[uVar103 * 2 + 1];
  fVar143 = fVar365 * (1.0 - (float)uVar10 * 0.33333334) + fVar115 * (float)uVar10 * 0.33333334;
  fVar212 = fVar365 * (1.0 - fVar212) + fVar115 * fVar212;
  fVar218 = fVar365 * (0.0 - fVar214) + fVar115 * fVar214;
  fVar217 = fVar365 * (0.0 - fVar217) + fVar115 * fVar217;
  fVar214 = fVar212 - fVar143;
  fVar186 = (float)local_348;
  fVar230 = local_348._4_4_;
  fVar365 = (float)uStack_340;
  fVar115 = uStack_340._4_4_;
  if (fVar214 < 0.16666667) {
    fVar355 = 1.0 - (float)local_418._0_4_;
    fVar305 = 1.0 - (float)local_418._0_4_;
    fVar231 = 1.0 - (float)local_418._4_4_;
    fVar232 = 1.0 - (float)local_418._4_4_;
    fVar275 = local_2c8._0_4_ * fVar355 + local_2f8 * (float)local_418._0_4_;
    fVar301 = local_2c8._4_4_ * fVar305 + fStack_2f4 * (float)local_418._0_4_;
    fVar363 = local_2c8._8_4_ * fVar231 + fStack_2f0 * (float)local_418._4_4_;
    fVar348 = local_2c8._12_4_ * fVar232 + fStack_2ec * (float)local_418._4_4_;
    fVar228 = local_2d8._0_4_ * fVar355 + (float)local_308._0_4_ * (float)local_418._0_4_;
    fVar229 = local_2d8._4_4_ * fVar305 + (float)local_308._4_4_ * (float)local_418._0_4_;
    fVar261 = local_2d8._8_4_ * fVar231 + fStack_300 * (float)local_418._4_4_;
    fVar273 = local_2d8._12_4_ * fVar232 + fStack_2fc * (float)local_418._4_4_;
    fVar337 = (float)local_348 * fVar355 + local_318 * (float)local_418._0_4_;
    fVar377 = local_348._4_4_ * fVar305 + fStack_314 * (float)local_418._0_4_;
    fVar379 = (float)uStack_340 * fVar231 + fStack_310 * (float)local_418._4_4_;
    fVar389 = uStack_340._4_4_ * fVar232 + fStack_30c * (float)local_418._4_4_;
    fVar318 = (fVar355 * (float)local_2e8._0_4_ + (float)local_418._0_4_ * (float)local_328._0_4_) -
              fVar337;
    fVar319 = (fVar305 * (float)local_2e8._4_4_ + (float)local_418._0_4_ * (float)local_328._4_4_) -
              fVar377;
    fVar320 = (fVar231 * fStack_2e0 + (float)local_418._4_4_ * fStack_320) - fVar379;
    fVar335 = (fVar232 * fStack_2dc + (float)local_418._4_4_ * fStack_31c) - fVar389;
    fVar355 = fVar143 * (fVar337 - fVar228) + fVar228;
    fVar305 = fVar143 * (fVar377 - fVar229) + fVar229;
    fVar231 = fVar143 * (fVar379 - fVar261) + fVar261;
    fVar232 = fVar143 * (fVar389 - fVar273) + fVar273;
    fVar368 = (fVar337 - fVar228) * fVar212 + fVar228;
    fVar378 = (fVar377 - fVar229) * fVar212 + fVar229;
    fVar387 = (fVar379 - fVar261) * fVar212 + fVar261;
    fVar391 = (fVar389 - fVar273) * fVar212 + fVar273;
    fVar393 = fVar143 * (fVar228 - fVar275) + fVar275;
    fVar399 = fVar143 * (fVar229 - fVar301) + fVar301;
    fVar400 = fVar143 * (fVar261 - fVar363) + fVar363;
    fVar401 = fVar143 * (fVar273 - fVar348) + fVar348;
    fVar393 = (fVar355 - fVar393) * fVar143 + fVar393;
    fVar399 = (fVar305 - fVar399) * fVar143 + fVar399;
    fVar400 = (fVar231 - fVar400) * fVar143 + fVar400;
    fVar401 = (fVar232 - fVar401) * fVar143 + fVar401;
    fVar355 = (((fVar143 * fVar318 + fVar337) - fVar355) * fVar143 + fVar355) - fVar393;
    fVar305 = (((fVar143 * fVar319 + fVar377) - fVar305) * fVar143 + fVar305) - fVar399;
    fVar231 = (((fVar143 * fVar320 + fVar379) - fVar231) * fVar143 + fVar231) - fVar400;
    fVar232 = (((fVar143 * fVar335 + fVar389) - fVar232) * fVar143 + fVar232) - fVar401;
    auVar208._0_4_ = fVar143 * fVar355 + fVar393;
    auVar208._4_4_ = fVar143 * fVar305 + fVar399;
    auVar208._8_4_ = fVar143 * fVar231 + fVar400;
    auVar208._12_4_ = fVar143 * fVar232 + fVar401;
    fVar275 = (fVar228 - fVar275) * fVar212 + fVar275;
    fVar301 = (fVar229 - fVar301) * fVar212 + fVar301;
    fVar363 = (fVar261 - fVar363) * fVar212 + fVar363;
    fVar348 = (fVar273 - fVar348) * fVar212 + fVar348;
    fVar275 = (fVar368 - fVar275) * fVar212 + fVar275;
    fVar301 = (fVar378 - fVar301) * fVar212 + fVar301;
    fVar363 = (fVar387 - fVar363) * fVar212 + fVar363;
    fVar348 = (fVar391 - fVar348) * fVar212 + fVar348;
    fVar229 = (((fVar318 * fVar212 + fVar337) - fVar368) * fVar212 + fVar368) - fVar275;
    fVar261 = (((fVar319 * fVar212 + fVar377) - fVar378) * fVar212 + fVar378) - fVar301;
    fVar273 = (((fVar320 * fVar212 + fVar379) - fVar387) * fVar212 + fVar387) - fVar363;
    fVar378 = (((fVar335 * fVar212 + fVar389) - fVar391) * fVar212 + fVar391) - fVar348;
    fVar275 = fVar212 * fVar229 + fVar275;
    fVar301 = fVar212 * fVar261 + fVar301;
    fVar363 = fVar212 * fVar273 + fVar363;
    fVar348 = fVar212 * fVar378 + fVar348;
    fVar228 = fVar214 * 0.33333334;
    fVar318 = fVar355 * (float)DAT_01f4afa0 * fVar228 + auVar208._0_4_;
    fVar319 = fVar305 * DAT_01f4afa0._4_4_ * fVar228 + auVar208._4_4_;
    fVar320 = fVar231 * DAT_01f4afa0._8_4_ * fVar228 + auVar208._8_4_;
    fVar335 = fVar232 * DAT_01f4afa0._12_4_ * fVar228 + auVar208._12_4_;
    fVar337 = fVar275 - fVar228 * fVar229 * (float)DAT_01f4afa0;
    fVar368 = fVar301 - fVar228 * fVar261 * DAT_01f4afa0._4_4_;
    fVar377 = fVar363 - fVar228 * fVar273 * DAT_01f4afa0._8_4_;
    fVar378 = fVar348 - fVar228 * fVar378 * DAT_01f4afa0._12_4_;
    auVar30._4_8_ = auVar385._8_8_;
    auVar30._0_4_ = auVar208._4_4_;
    auVar384._0_8_ = auVar30._0_8_ << 0x20;
    auVar384._8_4_ = auVar208._8_4_;
    auVar384._12_4_ = auVar208._12_4_;
    auVar385._8_8_ = auVar208._8_8_;
    auVar385._0_8_ = auVar384._8_8_;
    auVar31._4_8_ = DAT_01f4afa0._8_8_;
    auVar31._0_4_ = fVar301;
    auVar311._0_8_ = auVar31._0_8_ << 0x20;
    auVar311._8_4_ = fVar363;
    auVar311._12_4_ = fVar348;
    fVar355 = (fVar363 - fVar275) + (auVar208._8_4_ - auVar208._0_4_);
    fVar305 = (fVar348 - fVar301) + (auVar208._12_4_ - auVar208._4_4_);
    auVar330._0_4_ = fVar368 * fVar305;
    auVar330._4_4_ = fVar368 * fVar305;
    auVar330._8_4_ = fVar378 * fVar305;
    auVar330._12_4_ = fVar378 * fVar305;
    fVar228 = auVar208._0_4_ * fVar355 + auVar208._4_4_ * fVar305;
    fVar229 = auVar208._8_4_ * fVar355 + auVar208._12_4_ * fVar305;
    fVar231 = fVar318 * fVar355 + fVar319 * fVar305;
    fVar232 = fVar320 * fVar355 + fVar335 * fVar305;
    fVar379 = fVar337 * fVar355 + auVar330._0_4_;
    auVar296._0_8_ = CONCAT44(fVar368 * fVar355 + auVar330._4_4_,fVar379);
    auVar296._8_4_ = fVar377 * fVar355 + auVar330._8_4_;
    auVar296._12_4_ = fVar378 * fVar355 + auVar330._12_4_;
    fVar273 = fVar355 * fVar275 + fVar305 * fVar301;
    fVar387 = fVar355 * fVar363 + fVar305 * fVar348;
    auVar32._4_8_ = auVar330._8_8_;
    auVar32._0_4_ = fVar319 * fVar355 + fVar319 * fVar305;
    auVar331._0_8_ = auVar32._0_8_ << 0x20;
    auVar331._8_4_ = fVar232;
    auVar331._12_4_ = fVar335 * fVar355 + fVar335 * fVar305;
    fVar261 = fVar231;
    if (fVar231 <= fVar228) {
      fVar261 = fVar228;
      fVar228 = fVar231;
    }
    auVar332._8_8_ = auVar331._8_8_;
    auVar332._0_8_ = auVar332._8_8_;
    auVar131._8_4_ = auVar296._8_4_;
    auVar131._0_8_ = auVar296._0_8_;
    auVar131._12_4_ = auVar296._12_4_;
    if (fVar273 <= fVar379) {
      auVar131._0_4_ = fVar273;
    }
    if (auVar131._0_4_ <= fVar228) {
      fVar228 = auVar131._0_4_;
    }
    auVar33._4_8_ = auVar131._8_8_;
    auVar33._0_4_ = fVar355 * fVar301 + fVar305 * fVar301;
    auVar132._0_8_ = auVar33._0_8_ << 0x20;
    auVar132._8_4_ = fVar387;
    auVar132._12_4_ = fVar355 * fVar348 + fVar305 * fVar348;
    if (fVar273 <= fVar379) {
      fVar273 = fVar379;
    }
    auVar133._8_8_ = auVar132._8_8_;
    auVar133._0_8_ = auVar133._8_8_;
    if (fVar273 <= fVar261) {
      fVar273 = fVar261;
    }
    if (fVar232 <= fVar229) {
      auVar332._0_4_ = fVar229;
      fVar229 = fVar232;
    }
    auVar173._8_4_ = auVar296._8_4_;
    auVar173._0_8_ = auVar296._8_8_;
    auVar173._12_4_ = auVar296._12_4_;
    if (fVar387 <= auVar296._8_4_) {
      auVar173._0_4_ = fVar387;
    }
    if (auVar173._0_4_ <= fVar229) {
      fVar229 = auVar173._0_4_;
    }
    if (fVar387 <= auVar296._8_4_) {
      auVar133._0_4_ = auVar296._8_4_;
    }
    if (auVar133._0_4_ <= auVar332._0_4_) {
      auVar133._0_4_ = auVar332._0_4_;
    }
    bVar110 = 3 < (uint)uVar109;
    uVar34 = (undefined3)(uVar112 >> 8);
    fVar261 = auVar133._0_4_;
    if ((0.0001 <= fVar228) || (fVar261 <= -0.0001)) goto LAB_003ce496;
    goto LAB_003ce4df;
  }
  goto LAB_003cdb10;
LAB_003ce496:
  auVar175._0_12_ = ZEXT812(0x38d1b717);
  auVar175._12_4_ = 0.0;
  if ((0.0001 <= fVar229 || fVar273 <= -0.0001) &&
     ((0.0001 <= fVar228 || fVar273 <= -0.0001 &&
      (paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar34,bVar110),
      auVar130 = _local_3f8, 0.0001 <= fVar229 || fVar261 <= -0.0001)))) goto LAB_003ce177;
LAB_003ce4df:
  _local_338 = auVar385;
  local_3f8 = (undefined1  [8])auVar311._8_8_;
  auVar130 = _local_3f8;
  bVar110 = bVar110 || fVar214 < 0.001;
  paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar34,bVar110);
  fVar305 = (float)(~-(uint)(fVar228 < 0.0) & 0x3f800000 | -(uint)(fVar228 < 0.0) & 0xbf800000);
  fVar231 = (float)(~-(uint)(fVar273 < 0.0) & 0x3f800000 | -(uint)(fVar273 < 0.0) & 0xbf800000);
  fVar355 = 0.0;
  if ((fVar305 == fVar231) && (!NAN(fVar305) && !NAN(fVar231))) {
    fVar355 = INFINITY;
  }
  fVar232 = 0.0;
  if ((fVar305 == fVar231) && (!NAN(fVar305) && !NAN(fVar231))) {
    fVar232 = -INFINITY;
  }
  fVar379 = (float)(~-(uint)(fVar229 < 0.0) & 0x3f800000 | -(uint)(fVar229 < 0.0) & 0xbf800000);
  if ((fVar305 != fVar379) || (fVar387 = fVar232, NAN(fVar305) || NAN(fVar379))) {
    if ((fVar229 != fVar228) || (NAN(fVar229) || NAN(fVar228))) {
      fVar229 = -fVar228 / (fVar229 - fVar228);
      fVar229 = (1.0 - fVar229) * 0.0 + fVar229;
      fVar387 = fVar229;
    }
    else {
      fVar229 = 0.0;
      if ((fVar228 != 0.0) || (fVar387 = 1.0, NAN(fVar228))) {
        fVar229 = INFINITY;
        fVar387 = -INFINITY;
      }
    }
    if (fVar229 <= fVar355) {
      fVar355 = fVar229;
    }
    if (fVar387 <= fVar232) {
      fVar387 = fVar232;
    }
  }
  fVar228 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar261 < 0.0) * 4);
  if ((fVar231 != fVar228) || (fVar229 = fVar387, NAN(fVar231) || NAN(fVar228))) {
    if ((fVar261 != fVar273) || (NAN(fVar261) || NAN(fVar273))) {
      fVar305 = -fVar273 / (fVar261 - fVar273);
      fVar305 = (1.0 - fVar305) * 0.0 + fVar305;
      fVar229 = fVar305;
    }
    else {
      fVar305 = 0.0;
      if ((fVar273 != 0.0) || (fVar229 = 1.0, NAN(fVar273))) {
        fVar305 = INFINITY;
        fVar229 = -INFINITY;
      }
    }
    if (fVar305 <= fVar355) {
      fVar355 = fVar305;
    }
    if (fVar229 <= fVar387) {
      fVar229 = fVar387;
    }
  }
  if ((fVar379 != fVar228) || (NAN(fVar379) || NAN(fVar228))) {
    fVar355 = (float)(~-(uint)(fVar355 < 1.0) & 0x3f800000 | (uint)fVar355 & -(uint)(fVar355 < 1.0))
    ;
    fVar229 = (float)(~-(uint)(fVar229 < 1.0) & (uint)fVar229 | -(uint)(fVar229 < 1.0) & 0x3f800000)
    ;
  }
  auVar385._0_12_ = ZEXT812(0x3f800000);
  auVar385._12_4_ = 0.0;
  auVar174._0_8_ =
       CONCAT44(~-(uint)(fVar229 < 1.0),~-(uint)(fVar355 < 0.0) & (uint)fVar355) &
       0x3f800000ffffffff;
  auVar174._8_8_ = 0;
  auVar175 = auVar174 | ZEXT416((uint)fVar229 & -(uint)(fVar229 < 1.0)) << 0x20;
  fVar228 = auVar175._4_4_;
  auVar133._4_4_ = fVar228;
  auVar133._0_4_ = fVar228;
  auVar133._8_4_ = fVar228;
  auVar133._12_4_ = fVar228;
  fStack_3f0 = auVar190._8_4_;
  fStack_3ec = auVar190._12_4_;
  if (fVar228 < auVar175._0_4_) goto LAB_003ce177;
  fVar229 = auVar175._0_4_ + -0.1;
  fVar273 = auVar175._8_4_ + 0.0;
  fVar355 = auVar175._12_4_ + 0.0;
  uVar111 = -(uint)(fVar228 + 0.1 < 1.0);
  fVar229 = (float)(~-(uint)(fVar229 < 0.0) & (uint)fVar229);
  fVar228 = (float)(~uVar111 & 0x3f800000 | (uint)(fVar228 + 0.1) & uVar111);
  fVar391 = 1.0 - fVar229;
  fVar393 = 1.0 - fVar229;
  fVar399 = 1.0 - fVar228;
  fVar400 = 1.0 - fVar228;
  fVar305 = auVar208._0_4_ * fVar391 + auVar208._8_4_ * fVar229;
  fVar231 = auVar208._4_4_ * fVar393 + auVar208._12_4_ * fVar229;
  fVar232 = auVar208._0_4_ * fVar399 + auVar208._8_4_ * fVar228;
  fVar379 = auVar208._4_4_ * fVar400 + auVar208._12_4_ * fVar228;
  fVar387 = fVar318 * fVar391 + fVar320 * fVar229;
  fVar389 = fVar319 * fVar393 + fVar335 * fVar229;
  fVar318 = fVar318 * fVar399 + fVar320 * fVar228;
  fVar319 = fVar319 * fVar400 + fVar335 * fVar228;
  fVar320 = fVar337 * fVar391 + fVar377 * fVar229;
  fVar335 = fVar368 * fVar393 + fVar378 * fVar229;
  fVar337 = fVar337 * fVar399 + fVar377 * fVar228;
  fVar368 = fVar368 * fVar400 + fVar378 * fVar228;
  fVar377 = fVar391 * fVar275 + fVar363 * fVar229;
  fVar378 = fVar393 * fVar301 + fVar348 * fVar229;
  fVar391 = fVar399 * fVar275 + fStack_3f0 * fVar228;
  fVar393 = fVar400 * fVar301 + fStack_3ec * fVar228;
  fVar275 = (float)local_418._4_4_ * fVar273;
  fVar301 = (float)local_418._4_4_ * fVar355;
  fVar399 = (float)local_418._0_4_ * (1.0 - fVar228);
  fStack_410 = (float)local_418._0_4_ * (0.0 - fVar273);
  fStack_40c = (float)local_418._0_4_ * (0.0 - fVar355);
  local_418._0_4_ = (float)local_418._0_4_ * (1.0 - fVar229) + (float)local_418._4_4_ * fVar229;
  local_418._4_4_ = fVar399 + (float)local_418._4_4_ * fVar228;
  fStack_410 = fStack_410 + fVar275;
  fStack_40c = fStack_40c + fVar301;
  fVar214 = 1.0 / fVar214;
  auVar176._0_4_ = fVar391 - fVar377;
  auVar176._4_4_ = fVar393 - fVar378;
  auVar176._8_4_ = fVar391 - fVar391;
  auVar176._12_4_ = fVar393 - fVar393;
  auVar225._0_8_ = CONCAT44(fVar368 - fVar335,fVar337 - fVar320);
  auVar225._8_4_ = fVar337 - fVar337;
  auVar225._12_4_ = fVar368 - fVar368;
  auVar268._0_4_ = fVar318 - fVar387;
  auVar268._4_4_ = fVar319 - fVar389;
  auVar268._8_4_ = fVar318 - fVar318;
  auVar268._12_4_ = fVar319 - fVar319;
  auVar333._0_8_ = CONCAT44((fVar389 - fVar231) * 3.0,(fVar387 - fVar305) * 3.0);
  auVar333._8_4_ = (fVar318 - fVar232) * 3.0;
  auVar333._12_4_ = (fVar319 - fVar379) * 3.0;
  auVar251._0_8_ = CONCAT44((fVar335 - fVar389) * 3.0,(fVar320 - fVar387) * 3.0);
  auVar251._8_4_ = (fVar337 - fVar318) * 3.0;
  auVar251._12_4_ = (fVar368 - fVar319) * 3.0;
  auVar359._0_4_ = (fVar377 - fVar320) * 3.0;
  auVar359._4_4_ = (fVar378 - fVar335) * 3.0;
  auVar359._8_4_ = (fVar391 - fVar337) * 3.0;
  auVar359._12_4_ = (fVar393 - fVar368) * 3.0;
  auVar297._8_4_ = auVar251._8_4_;
  auVar297._0_8_ = auVar251._0_8_;
  auVar297._12_4_ = auVar251._12_4_;
  auVar235 = minps(auVar297,auVar359);
  auVar190 = maxps(auVar251,auVar359);
  auVar344._8_4_ = auVar333._8_4_;
  auVar344._0_8_ = auVar333._0_8_;
  auVar344._12_4_ = auVar333._12_4_;
  auVar202 = minps(auVar344,auVar235);
  auVar169 = maxps(auVar333,auVar190);
  auVar35._4_8_ = auVar190._8_8_;
  auVar35._0_4_ = auVar202._4_4_;
  auVar252._0_8_ = auVar35._0_8_ << 0x20;
  auVar252._8_4_ = auVar202._8_4_;
  auVar252._12_4_ = auVar202._12_4_;
  auVar253._8_8_ = auVar202._8_8_;
  auVar253._0_8_ = auVar252._8_8_;
  auVar36._4_8_ = auVar235._8_8_;
  auVar36._0_4_ = auVar169._4_4_;
  auVar298._0_8_ = auVar36._0_8_ << 0x20;
  auVar298._8_4_ = auVar169._8_4_;
  auVar298._12_4_ = auVar169._12_4_;
  auVar299._8_8_ = auVar169._8_8_;
  auVar299._0_8_ = auVar298._8_8_;
  auVar235 = minps(auVar202,auVar253);
  auVar190 = maxps(auVar169,auVar299);
  fVar400 = auVar235._0_4_ * fVar214;
  fVar401 = auVar235._4_4_ * fVar214;
  fVar402 = auVar235._8_4_ * fVar214;
  fVar408 = auVar235._12_4_ * fVar214;
  fVar335 = fVar214 * auVar190._0_4_;
  fVar368 = fVar214 * auVar190._4_4_;
  fVar378 = fVar214 * auVar190._8_4_;
  fVar214 = fVar214 * auVar190._12_4_;
  fVar393 = 1.0 / ((float)local_418._4_4_ - (float)local_418._0_4_);
  auVar134._0_8_ = CONCAT44(fVar379 - fVar231,fVar232 - fVar305);
  auVar134._8_4_ = fVar232 - fVar232;
  auVar134._12_4_ = fVar379 - fVar379;
  auVar312._8_4_ = auVar134._8_4_;
  auVar312._0_8_ = auVar134._0_8_;
  auVar312._12_4_ = auVar134._12_4_;
  auVar169 = minps(auVar312,auVar268);
  auVar190 = maxps(auVar134,auVar268);
  auVar209._8_4_ = auVar225._8_4_;
  auVar209._0_8_ = auVar225._0_8_;
  auVar209._12_4_ = auVar225._12_4_;
  auVar235 = minps(auVar209,auVar176);
  auVar169 = minps(auVar169,auVar235);
  auVar235 = maxps(auVar225,auVar176);
  auVar190 = maxps(auVar190,auVar235);
  fVar389 = auVar169._0_4_ * fVar393;
  fVar391 = auVar169._4_4_ * fVar393;
  fVar399 = fVar393 * auVar190._0_4_;
  fVar393 = fVar393 * auVar190._4_4_;
  local_3f8._4_4_ = local_418._0_4_;
  local_3f8._0_4_ = fVar143;
  fStack_3f0 = fVar212;
  fStack_3ec = (float)local_418._4_4_;
  auVar300._4_4_ = local_418._4_4_;
  auVar300._0_4_ = fVar212;
  auVar300._8_4_ = fVar218;
  auVar300._12_4_ = fVar217;
  fVar232 = (fVar143 + fVar212) * 0.5;
  fVar318 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
  fVar319 = (fVar212 + fVar218) * 0.0;
  fVar320 = ((float)local_418._4_4_ + fVar217) * 0.0;
  fVar228 = local_88 * fVar232 + fVar363;
  fVar229 = fStack_84 * fVar232 + fVar348;
  fVar273 = fStack_80 * fVar232 + fVar144;
  fVar275 = fStack_7c * fVar232 + fVar187;
  fVar355 = local_98 * fVar232 + local_2a8;
  fVar301 = fStack_94 * fVar232 + fStack_2a4;
  fVar305 = fStack_90 * fVar232 + (float)uStack_2a0;
  fVar231 = fStack_8c * fVar232 + uStack_2a0._4_4_;
  fVar228 = (fVar355 - fVar228) * fVar232 + fVar228;
  fVar229 = (fVar301 - fVar229) * fVar232 + fVar229;
  fVar273 = (fVar305 - fVar273) * fVar232 + fVar273;
  fVar275 = (fVar231 - fVar275) * fVar232 + fVar275;
  fVar355 = (((local_a8 * fVar232 + (float)local_2b8) - fVar355) * fVar232 + fVar355) - fVar228;
  fVar301 = (((fStack_a4 * fVar232 + local_2b8._4_4_) - fVar301) * fVar232 + fVar301) - fVar229;
  fVar305 = (((fStack_a0 * fVar232 + fStack_2b0) - fVar305) * fVar232 + fVar305) - fVar273;
  fVar231 = (((fStack_9c * fVar232 + fStack_2ac) - fVar231) * fVar232 + fVar231) - fVar275;
  fVar228 = fVar232 * fVar355 + fVar228;
  fVar229 = fVar232 * fVar301 + fVar229;
  fVar355 = fVar355 * 3.0;
  fVar301 = fVar301 * 3.0;
  fVar273 = (fVar232 * fVar305 + fVar273) - fVar228;
  fVar275 = (fVar232 * fVar231 + fVar275) - fVar229;
  fVar355 = (fVar305 * 3.0 - fVar355) * fVar318 + fVar355;
  fVar301 = (fVar231 * 3.0 - fVar301) * fVar318 + fVar301;
  auVar226._0_8_ = CONCAT44(fVar355,fVar273) ^ 0x80000000;
  auVar226._8_4_ = fVar355;
  auVar226._12_4_ = fVar355;
  fVar409 = fVar143 - fVar232;
  fVar410 = (float)local_418._0_4_ - fVar318;
  fVar215 = fVar212 - fVar319;
  fVar216 = (float)local_418._4_4_ - fVar320;
  fVar356 = fVar212 - fVar232;
  fVar364 = (float)local_418._4_4_ - fVar318;
  fVar218 = fVar218 - fVar319;
  fVar217 = fVar217 - fVar320;
  fVar228 = fVar273 * fVar318 + fVar228;
  fVar229 = fVar275 * fVar318 + fVar229;
  auVar254._0_8_ = CONCAT44(fVar301,fVar275) ^ 0x8000000000000000;
  auVar254._8_4_ = -fVar301;
  auVar254._12_4_ = -fVar301;
  auVar135._0_4_ = fVar275 * fVar355 - fVar301 * fVar273;
  auVar135._4_4_ = auVar135._0_4_;
  auVar135._8_4_ = auVar135._0_4_;
  auVar135._12_4_ = auVar135._0_4_;
  auVar235 = divps(auVar254,auVar135);
  auVar190 = divps(auVar226,auVar135);
  fVar319 = auVar235._0_4_;
  fVar320 = auVar235._4_4_;
  fVar305 = auVar190._0_4_;
  fVar231 = auVar190._4_4_;
  fVar232 = fVar232 - (fVar229 * fVar305 + fVar228 * fVar319);
  fVar355 = fVar318 - (fVar229 * fVar231 + fVar228 * fVar320);
  fVar301 = fVar318 - (fVar229 * auVar190._8_4_ + fVar228 * auVar235._8_4_);
  fVar318 = fVar318 - (fVar229 * auVar190._12_4_ + fVar228 * auVar235._12_4_);
  auVar177._0_8_ = CONCAT44(fVar320 * fVar389,fVar320 * fVar400);
  auVar177._8_4_ = fVar320 * fVar401;
  auVar177._12_4_ = fVar320 * fVar391;
  auVar136._0_4_ = fVar320 * fVar335;
  auVar136._4_4_ = fVar320 * fVar399;
  auVar136._8_4_ = fVar320 * fVar368;
  auVar136._12_4_ = fVar320 * fVar393;
  auVar407._8_4_ = auVar177._8_4_;
  auVar407._0_8_ = auVar177._0_8_;
  auVar407._12_4_ = auVar177._12_4_;
  auVar202 = minps(auVar407,auVar136);
  auVar190 = maxps(auVar136,auVar177);
  auVar269._0_8_ = CONCAT44(fVar231 * fVar391,fVar231 * fVar401);
  auVar269._8_4_ = fVar231 * fVar402;
  auVar269._12_4_ = fVar231 * fVar408;
  auVar178._0_4_ = fVar231 * fVar368;
  auVar178._4_4_ = fVar231 * fVar393;
  auVar178._8_4_ = fVar231 * fVar378;
  auVar178._12_4_ = fVar231 * fVar214;
  auVar345._8_4_ = auVar269._8_4_;
  auVar345._0_8_ = auVar269._0_8_;
  auVar345._12_4_ = auVar269._12_4_;
  auVar169 = minps(auVar345,auVar178);
  auVar235 = maxps(auVar178,auVar269);
  fVar228 = 0.0 - (auVar235._0_4_ + auVar190._0_4_);
  fVar229 = 1.0 - (auVar235._4_4_ + auVar190._4_4_);
  fVar273 = 0.0 - (auVar235._8_4_ + auVar190._8_4_);
  fVar275 = 0.0 - (auVar235._12_4_ + auVar190._12_4_);
  fVar337 = 0.0 - (auVar169._0_4_ + auVar202._0_4_);
  fVar377 = 1.0 - (auVar169._4_4_ + auVar202._4_4_);
  fVar379 = 0.0 - (auVar169._8_4_ + auVar202._8_4_);
  fVar387 = 0.0 - (auVar169._12_4_ + auVar202._12_4_);
  auVar179._0_8_ = CONCAT44(fVar410 * fVar229,fVar409 * fVar228);
  auVar179._8_4_ = fVar215 * fVar273;
  auVar179._12_4_ = fVar216 * fVar275;
  auVar360._0_8_ = CONCAT44(fVar389 * fVar319,fVar400 * fVar319);
  auVar360._8_4_ = fVar401 * fVar319;
  auVar360._12_4_ = fVar391 * fVar319;
  auVar270._0_4_ = fVar319 * fVar335;
  auVar270._4_4_ = fVar319 * fVar399;
  auVar270._8_4_ = fVar319 * fVar368;
  auVar270._12_4_ = fVar319 * fVar393;
  auVar346._8_4_ = auVar360._8_4_;
  auVar346._0_8_ = auVar360._0_8_;
  auVar346._12_4_ = auVar360._12_4_;
  auVar235 = minps(auVar346,auVar270);
  auVar190 = maxps(auVar270,auVar360);
  auVar313._0_8_ = CONCAT44(fVar391 * fVar305,fVar401 * fVar305);
  auVar313._8_4_ = fVar402 * fVar305;
  auVar313._12_4_ = fVar408 * fVar305;
  auVar361._0_4_ = fVar305 * fVar368;
  auVar361._4_4_ = fVar305 * fVar393;
  auVar361._8_4_ = fVar305 * fVar378;
  auVar361._12_4_ = fVar305 * fVar214;
  auVar398._8_4_ = auVar313._8_4_;
  auVar398._0_8_ = auVar313._0_8_;
  auVar398._12_4_ = auVar313._12_4_;
  auVar202 = minps(auVar398,auVar361);
  auVar347._0_4_ = fVar409 * fVar337;
  auVar347._4_4_ = fVar410 * fVar377;
  auVar347._8_4_ = fVar215 * fVar379;
  auVar347._12_4_ = fVar216 * fVar387;
  auVar137._0_8_ = CONCAT44(fVar229 * fVar364,fVar228 * fVar356);
  auVar137._8_4_ = fVar273 * fVar218;
  auVar137._12_4_ = fVar275 * fVar217;
  auVar279._0_4_ = fVar337 * fVar356;
  auVar279._4_4_ = fVar377 * fVar364;
  auVar279._8_4_ = fVar379 * fVar218;
  auVar279._12_4_ = fVar387 * fVar217;
  auVar169 = maxps(auVar361,auVar313);
  fVar214 = 1.0 - (auVar169._0_4_ + auVar190._0_4_);
  fVar228 = 0.0 - (auVar169._4_4_ + auVar190._4_4_);
  fVar229 = 0.0 - (auVar169._8_4_ + auVar190._8_4_);
  fVar273 = 0.0 - (auVar169._12_4_ + auVar190._12_4_);
  fVar275 = 1.0 - (auVar202._0_4_ + auVar235._0_4_);
  fVar335 = 0.0 - (auVar202._4_4_ + auVar235._4_4_);
  fVar337 = 0.0 - (auVar202._8_4_ + auVar235._8_4_);
  fVar368 = 0.0 - (auVar202._12_4_ + auVar235._12_4_);
  auVar314._0_8_ = CONCAT44(fVar410 * fVar228,fVar409 * fVar214);
  auVar314._8_4_ = fVar215 * fVar229;
  auVar314._12_4_ = fVar216 * fVar273;
  auVar376._0_4_ = fVar409 * fVar275;
  auVar376._4_4_ = fVar410 * fVar335;
  auVar376._8_4_ = fVar215 * fVar337;
  auVar376._12_4_ = fVar216 * fVar368;
  auVar271._0_8_ = CONCAT44(fVar228 * fVar364,fVar214 * fVar356);
  auVar271._8_4_ = fVar229 * fVar218;
  auVar271._12_4_ = fVar273 * fVar217;
  auVar334._0_4_ = fVar275 * fVar356;
  auVar334._4_4_ = fVar335 * fVar364;
  auVar334._8_4_ = fVar337 * fVar218;
  auVar334._12_4_ = fVar368 * fVar217;
  auVar362._8_4_ = auVar314._8_4_;
  auVar362._0_8_ = auVar314._0_8_;
  auVar362._12_4_ = auVar314._12_4_;
  auVar190 = minps(auVar362,auVar376);
  auVar386._8_4_ = auVar271._8_4_;
  auVar386._0_8_ = auVar271._0_8_;
  auVar386._12_4_ = auVar271._12_4_;
  auVar235 = minps(auVar386,auVar334);
  auVar329 = minps(auVar190,auVar235);
  auVar385._0_12_ = ZEXT812(0x3f800000);
  auVar385._12_4_ = 0.0;
  auVar235 = maxps(auVar376,auVar314);
  auVar190 = maxps(auVar334,auVar271);
  auVar169 = maxps(auVar190,auVar235);
  auVar315._8_4_ = auVar179._8_4_;
  auVar315._0_8_ = auVar179._0_8_;
  auVar315._12_4_ = auVar179._12_4_;
  auVar235 = minps(auVar315,auVar347);
  auVar272._8_4_ = auVar137._8_4_;
  auVar272._0_8_ = auVar137._0_8_;
  auVar272._12_4_ = auVar137._12_4_;
  auVar190 = minps(auVar272,auVar279);
  auVar235 = minps(auVar235,auVar190);
  auVar202 = maxps(auVar347,auVar179);
  auVar190 = maxps(auVar279,auVar137);
  auVar190 = maxps(auVar190,auVar202);
  auVar316._0_4_ = auVar329._4_4_ + auVar329._0_4_ + fVar232;
  auVar316._4_4_ = auVar235._4_4_ + auVar235._0_4_ + fVar355;
  auVar316._8_4_ = auVar329._8_4_ + auVar329._4_4_ + fVar301;
  auVar316._12_4_ = auVar329._12_4_ + auVar235._4_4_ + fVar318;
  fVar214 = auVar169._4_4_ + auVar169._0_4_ + fVar232;
  fVar217 = auVar190._4_4_ + auVar190._0_4_ + fVar355;
  auVar138._4_4_ = fVar217;
  auVar138._0_4_ = fVar214;
  auVar175 = maxps(_local_3f8,auVar316);
  auVar138._8_4_ = auVar169._8_4_ + auVar169._4_4_ + fVar301;
  auVar138._12_4_ = auVar169._12_4_ + auVar190._4_4_ + fVar318;
  auVar190 = minps(auVar138,auVar300);
  iVar146 = -(uint)(auVar190._0_4_ < auVar175._0_4_);
  iVar181 = -(uint)(auVar190._4_4_ < auVar175._4_4_);
  auVar139._4_4_ = iVar181;
  auVar139._0_4_ = iVar146;
  auVar139._8_4_ = iVar181;
  auVar139._12_4_ = iVar181;
  auVar133._8_8_ = auVar139._8_8_;
  auVar133._4_4_ = (float)iVar146;
  auVar133._0_4_ = (float)iVar146;
  iVar146 = movmskpd((uint)(fVar261 < 0.0),auVar133);
  auVar130 = _local_3f8;
  if (iVar146 != 0) goto LAB_003ce177;
  bVar101 = 0;
  if ((fVar143 < auVar316._0_4_) && (fVar214 < fVar212)) {
    bVar101 = -(fVar217 < (float)local_418._4_4_) & (float)local_418._0_4_ < auVar316._4_4_;
  }
  bVar101 = bVar110 | bVar101;
  uVar103 = (ulong)CONCAT31(uVar34,bVar101);
  if (bVar101 != 1) goto LAB_003cdb10;
  paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0xc9;
  do {
    paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar104 + -1);
    if (paVar104 == (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0) goto LAB_003ce177;
    fVar115 = 1.0 - fVar232;
    fVar217 = fVar232 * fVar232 * fVar232;
    fVar214 = fVar232 * fVar232 * 3.0 * fVar115;
    fVar365 = fVar115 * fVar115 * fVar115;
    fVar218 = fVar232 * 3.0 * fVar115 * fVar115;
    fVar115 = fVar365 * fVar363 +
              fVar218 * local_2a8 + fVar214 * (float)local_2b8 + fVar217 * local_b8._0_4_;
    fVar143 = fVar365 * fVar348 +
              fVar218 * fStack_2a4 + fVar214 * local_2b8._4_4_ + fVar217 * local_b8._4_4_;
    fVar212 = fVar365 * fVar144 +
              fVar218 * (float)uStack_2a0 + fVar214 * fStack_2b0 + fVar217 * local_b8._8_4_;
    fVar214 = fVar365 * fVar187 +
              fVar218 * uStack_2a0._4_4_ + fVar214 * fStack_2ac + fVar217 * local_b8._12_4_;
    fVar217 = (fVar212 - fVar115) * fVar355;
    fVar218 = (fVar214 - fVar143) * fVar355;
    fVar365 = (fVar212 - fVar115) * fVar355 + fVar115;
    fVar212 = (fVar214 - fVar143) * fVar355 + fVar143;
    fVar232 = fVar232 - (fVar212 * fVar305 + fVar365 * fVar319);
    fVar355 = fVar355 - (fVar212 * fVar231 + fVar365 * fVar320);
    fVar214 = ABS(fVar212);
    auVar133._0_8_ = CONCAT44(fVar212,fVar365) & 0x7fffffff7fffffff;
    auVar133._8_4_ = ABS(fVar217 + fVar115);
    auVar133._12_4_ = ABS(fVar218 + fVar143);
    auVar175._0_8_ = CONCAT44(fVar212,fVar212) & 0x7fffffff7fffffff;
    auVar175._8_4_ = fVar214;
    auVar175._12_4_ = fVar214;
    if (fVar214 <= ABS(fVar365)) {
      auVar175._0_4_ = ABS(fVar365);
    }
  } while (local_c8 <= auVar175._0_4_);
  if ((((fVar232 < 0.0) || (1.0 < fVar232)) ||
      (auVar175._4_4_ = fVar355, auVar175._0_4_ = fVar355, auVar175._8_4_ = fVar355,
      auVar175._12_4_ = fVar355, fVar355 < 0.0)) || (1.0 < fVar355)) goto LAB_003ce177;
  fVar365 = (pre->ray_space).vx.field_0.m128[2];
  fVar115 = (pre->ray_space).vy.field_0.m128[2];
  fVar143 = (pre->ray_space).vz.field_0.m128[2];
  fVar212 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar214 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar217 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar218 = (ray->super_RayK<1>).org.field_0.m128[3];
  auVar140._0_4_ = (local_388 - fVar212) * fVar365;
  auVar140._4_4_ = (fStack_384 - fVar214) * fVar115;
  auVar140._8_4_ = (fStack_380 - fVar217) * fVar143;
  auVar140._12_4_ = (fStack_37c - fVar218) * 0.0;
  auVar141._8_8_ = auVar140._8_8_;
  auVar141._0_8_ = auVar141._8_8_;
  auVar133._4_12_ = auVar141._4_12_;
  fVar273 = 1.0 - fVar355;
  fVar261 = 1.0 - fVar232;
  fVar228 = fVar261 * fVar261 * fVar261;
  fVar229 = fVar232 * 3.0 * fVar261 * fVar261;
  fVar230 = fVar232 * fVar232 * fVar232;
  fVar186 = fVar232 * fVar232 * 3.0 * fVar261;
  auVar133._0_4_ =
       ((auVar140._8_4_ + auVar140._4_4_ + auVar140._0_4_) * fVar273 +
       ((fStack_370 - fVar217) * fVar143 +
       (fStack_374 - fVar214) * fVar115 + (local_378 - fVar212) * fVar365) * fVar355) * fVar228 +
       (((fStack_390 - fVar217) * fVar143 +
        (fStack_394 - fVar214) * fVar115 + (local_398 - fVar212) * fVar365) * fVar273 +
       ((fStack_360 - fVar217) * fVar143 +
       (fStack_364 - fVar214) * fVar115 + (local_368 - fVar212) * fVar365) * fVar355) * fVar229 +
       (((fStack_3b0 - fVar217) * fVar143 +
        (fStack_3b4 - fVar214) * fVar115 + (local_3b8 - fVar212) * fVar365) * fVar273 +
       ((local_3cc.m128[3] - fVar217) * fVar143 +
       (local_3cc.m128[2] - fVar214) * fVar115 + (local_3cc.m128[1] - fVar212) * fVar365) * fVar355)
       * fVar186 +
       (fVar273 * ((fStack_3a0 - fVar217) * fVar143 +
                  (fStack_3a4 - fVar214) * fVar115 + (local_3a8 - fVar212) * fVar365) +
       ((fStack_210 - fVar217) * fVar143 +
       (fStack_214 - fVar214) * fVar115 + (local_218 - fVar212) * fVar365) * fVar355) * fVar230;
  if (auVar133._0_4_ < fVar218) goto LAB_003ce177;
  fVar365 = (ray->super_RayK<1>).tfar;
  auVar385 = ZEXT416((uint)fVar365);
  if (fVar365 < auVar133._0_4_) goto LAB_003ce177;
  fVar217 = 1.0 - fVar355;
  fVar218 = 1.0 - fVar355;
  fVar273 = 1.0 - fVar355;
  fVar275 = 1.0 - fVar355;
  fVar115 = local_398 * fVar217 + local_368 * fVar355;
  fVar143 = fStack_394 * fVar218 + fStack_364 * fVar355;
  fVar212 = fStack_390 * fVar273 + fStack_360 * fVar355;
  fVar214 = fStack_38c * fVar275 + fStack_35c * fVar355;
  fVar301 = local_3b8 * fVar217 + local_3cc.m128[1] * fVar355;
  fVar363 = fStack_3b4 * fVar218 + local_3cc.m128[2] * fVar355;
  fVar231 = fStack_3b0 * fVar273 + local_3cc.m128[3] * fVar355;
  fVar319 = fStack_3ac * fVar275 + fStack_3bc * fVar355;
  fVar305 = fVar301 - fVar115;
  fVar348 = fVar363 - fVar143;
  fVar318 = fVar231 - fVar212;
  fVar320 = fVar319 - fVar214;
  auVar175._4_4_ = fVar232;
  auVar175._0_4_ = fVar232;
  auVar175._8_4_ = fVar232;
  auVar175._12_4_ = fVar232;
  fVar115 = (((fVar115 - (local_388 * fVar217 + local_378 * fVar355)) * fVar261 + fVar232 * fVar305)
             * fVar261 +
            (fVar305 * fVar261 + ((fVar217 * local_3a8 + fVar355 * local_218) - fVar301) * fVar232)
            * fVar232) * 3.0;
  fVar143 = (((fVar143 - (fStack_384 * fVar218 + fStack_374 * fVar355)) * fVar261 +
             fVar232 * fVar348) * fVar261 +
            (fVar348 * fVar261 + ((fVar218 * fStack_3a4 + fVar355 * fStack_214) - fVar363) * fVar232
            ) * fVar232) * 3.0;
  fVar212 = (((fVar212 - (fStack_380 * fVar273 + fStack_370 * fVar355)) * fVar261 +
             fVar232 * fVar318) * fVar261 +
            (fVar318 * fVar261 + ((fVar273 * fStack_3a0 + fVar355 * fStack_210) - fVar231) * fVar232
            ) * fVar232) * 3.0;
  fVar214 = (((fVar214 - (fStack_37c * fVar275 + fStack_36c * fVar355)) * fVar261 +
             fVar232 * fVar320) * fVar261 +
            (fVar320 * fVar261 + ((fVar275 * fStack_39c + fVar355 * fStack_20c) - fVar319) * fVar232
            ) * fVar232) * 3.0;
  pGVar20 = (context->scene->geometries).items[local_3d8].ptr;
  uVar111 = (ray->super_RayK<1>).mask;
  paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar111;
  if ((pGVar20->mask & uVar111) == 0) goto LAB_003ce177;
  fVar217 = fVar228 * local_188 + fVar229 * local_198 + fVar186 * local_1a8 + fVar230 * local_1b8;
  fVar218 = fVar228 * fStack_184 +
            fVar229 * fStack_194 + fVar186 * fStack_1a4 + fVar230 * fStack_1b4;
  fVar261 = fVar228 * fStack_180 +
            fVar229 * fStack_190 + fVar186 * fStack_1a0 + fVar230 * fStack_1b0;
  fVar228 = fVar228 * fStack_17c +
            fVar229 * fStack_18c + fVar186 * fStack_19c + fVar230 * fStack_1ac;
  auVar175._0_4_ = fVar218 * fVar115 - fVar143 * fVar217;
  auVar175._4_4_ = fVar261 * fVar143 - fVar212 * fVar218;
  auVar175._8_4_ = fVar217 * fVar212 - fVar115 * fVar261;
  auVar175._12_4_ = fVar228 * fVar214 - fVar214 * fVar228;
  uVar219 = CONCAT44(auVar175._8_4_,auVar175._4_4_);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = auVar133._0_4_;
    *(undefined8 *)&(ray->Ng).field_0 = uVar219;
    (ray->Ng).field_0.field_0.z = auVar175._0_4_;
    ray->u = fVar232;
    ray->v = fVar355;
    ray->primID = (uint)local_350;
    ray->geomID = (uint)fVar280;
    ray->instID[0] = context->user->instID[0];
    uVar111 = context->user->instPrimID[0];
    ray->instPrimID[0] = uVar111;
    paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar111;
    goto LAB_003ce177;
  }
  local_1f8 = uVar219;
  local_1f0 = auVar175._0_4_;
  local_1ec = fVar232;
  fStack_1e8 = fVar355;
  local_1e4 = (uint)local_350;
  local_1e0 = fVar280;
  local_1dc = context->user->instID[0];
  local_1d8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = auVar133._0_4_;
  local_3cc.m128[0] = -NAN;
  local_288.valid = (int *)&local_3cc;
  local_288.geometryUserPtr = pGVar20->userPtr;
  local_288.context = context->user;
  local_288.ray = (RTCRayN *)ray;
  local_288.hit = (RTCHitN *)&local_1f8;
  local_288.N = 1;
  if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar20->intersectionFilterN)(&local_288);
    auVar175._8_8_ = extraout_XMM1_Qb;
    auVar175._0_8_ = extraout_XMM1_Qa;
    if (*(float *)local_288.valid == 0.0) goto LAB_003cf20b;
  }
  p_Var25 = context->args->filter;
  if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var25)(&local_288);
    auVar175._8_8_ = extraout_XMM1_Qb_00;
    auVar175._0_8_ = extraout_XMM1_Qa_00;
    if (*(float *)local_288.valid == 0.0) {
LAB_003cf20b:
      auVar133 = ZEXT416((uint)fVar365);
      (ray->super_RayK<1>).tfar = fVar365;
      paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.valid;
      goto LAB_003ce177;
    }
  }
  *(float *)((long)local_288.ray + 0x30) = *(float *)local_288.hit;
  *(float *)((long)local_288.ray + 0x34) = *(float *)(local_288.hit + 4);
  *(float *)((long)local_288.ray + 0x38) = *(float *)(local_288.hit + 8);
  *(float *)((long)local_288.ray + 0x3c) = *(float *)(local_288.hit + 0xc);
  auVar133 = ZEXT416((uint)*(float *)(local_288.hit + 0x10));
  *(float *)((long)local_288.ray + 0x40) = *(float *)(local_288.hit + 0x10);
  *(float *)((long)local_288.ray + 0x44) = *(float *)(local_288.hit + 0x14);
  *(float *)((long)local_288.ray + 0x48) = *(float *)(local_288.hit + 0x18);
  *(float *)((long)local_288.ray + 0x4c) = *(float *)(local_288.hit + 0x1c);
  *(float *)((long)local_288.ray + 0x50) = *(float *)(local_288.hit + 0x20);
  paVar104 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.ray;
  goto LAB_003ce177;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }